

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_diag_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  __m256i vWH_00;
  __m256i vWH_01;
  __m256i vWH_02;
  __m256i vWH_03;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined8 uVar60;
  undefined1 auVar61 [24];
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [24];
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined1 auVar71 [24];
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined1 auVar76 [24];
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  long lVar86;
  long lVar87;
  int64_t iVar88;
  long lVar89;
  long lVar90;
  int64_t iVar91;
  long lVar92;
  long lVar93;
  int64_t iVar94;
  int in_ECX;
  long lVar95;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 uVar96;
  long lVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined8 uVar111;
  undefined1 auVar108 [16];
  long lVar112;
  undefined8 uVar113;
  long lVar114;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined8 uVar115;
  long lVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  long in_stack_00000008;
  int32_t k;
  int64_t *j_1;
  int64_t *i_1;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m256i cond_Jlt;
  __m256i cond_all;
  __m256i cond_max;
  __m256i cond_eq;
  __m256i cond_valid_IJ;
  __m256i cond_valid_J;
  __m256i cond;
  __m256i vNWL;
  __m256i vNWS;
  __m256i vNWM;
  __m256i vNWH;
  __m256i vMat;
  __m256i vIltLimit;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m256i vs2;
  __m256i vs1;
  __m256i vJ;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_ext;
  __m256i vF_opn;
  __m256i vF;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_ext;
  __m256i vE_opn;
  __m256i vE;
  __m256i vWL;
  __m256i vWS;
  __m256i vWM;
  __m256i vWH;
  __m256i vNL;
  __m256i vNS;
  __m256i vNM;
  __m256i vNH;
  __m256i case0;
  __m256i case2;
  __m256i case1;
  __m256i vJLimit;
  __m256i vILimit;
  __m256i vEndJ;
  __m256i vEndI;
  __m256i vMaxL;
  __m256i vMaxS;
  __m256i vMaxM;
  __m256i vMaxH;
  __m256i vJreset;
  __m256i vI;
  __m256i vNegOne;
  __m256i vN;
  __m256i vOne;
  __m256i vZero;
  __m256i vGap;
  __m256i vOpen;
  __m256i vNegInf0;
  __m256i vNegInf;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int64_t *FL_pr;
  int64_t *FS_pr;
  int64_t *FM_pr;
  int64_t *F_pr;
  int64_t *HL_pr;
  int64_t *HS_pr;
  int64_t *HM_pr;
  int64_t *H_pr;
  int64_t *s2;
  int64_t *_FL_pr;
  int64_t *_FS_pr;
  int64_t *_FM_pr;
  int64_t *_F_pr;
  int64_t *_HL_pr;
  int64_t *_HS_pr;
  int64_t *_HM_pr;
  int64_t *_H_pr;
  int64_t *s2B;
  int64_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int local_257c;
  long lVar142;
  undefined4 in_stack_ffffffffffffdaa0;
  int in_stack_ffffffffffffdaa4;
  long lVar143;
  undefined4 in_stack_ffffffffffffdac0;
  int in_stack_ffffffffffffdac4;
  long local_2538;
  undefined4 in_stack_ffffffffffffdae0;
  int in_stack_ffffffffffffdae4;
  long lVar144;
  undefined4 in_stack_ffffffffffffdb0c;
  int iVar145;
  longlong in_stack_ffffffffffffdb10;
  long *plVar146;
  long *local_24e8;
  ulong *local_24e0;
  ulong *local_24d8;
  ulong *local_24d0;
  ulong *local_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  long local_2380;
  long lStack_2378;
  long lStack_2370;
  long lStack_2368;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2300 [24];
  long lStack_22e8;
  long local_22e0;
  long lStack_22d8;
  long lStack_22d0;
  long lStack_22c8;
  undefined1 local_22c0 [32];
  undefined1 local_22a0 [24];
  long lStack_2288;
  undefined1 local_2280 [24];
  long lStack_2268;
  undefined1 local_2260 [24];
  long lStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  long local_2220;
  long lStack_2218;
  long lStack_2210;
  long lStack_2208;
  undefined1 local_2200 [24];
  long lStack_21e8;
  undefined1 local_21e0 [32];
  undefined1 local_21c0 [32];
  undefined1 local_21a0 [32];
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined1 local_2140 [32];
  undefined1 local_2120 [24];
  long lStack_2108;
  undefined1 local_2100 [24];
  long lStack_20e8;
  undefined1 local_20e0 [24];
  long lStack_20c8;
  undefined1 local_20c0 [24];
  long lStack_20a8;
  undefined1 local_20a0 [32];
  undefined1 local_2080 [32];
  undefined1 local_2060 [32];
  undefined1 local_2040 [32];
  undefined1 local_1fe0 [16];
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined1 local_1f80 [32];
  undefined1 local_1f60 [32];
  undefined1 local_1f40 [32];
  undefined1 local_1f20 [32];
  undefined1 local_1f00 [32];
  undefined1 local_1ee0 [32];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  long local_1e80;
  long lStack_1e78;
  long lStack_1e70;
  long lStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  long local_1e20;
  long lStack_1e18;
  long lStack_1e10;
  long lStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [32];
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  ulong local_1d00;
  ulong local_1cf8;
  ulong local_1cf0;
  ulong local_1ce8;
  ulong local_1ce0;
  ulong local_1cd8;
  int local_1cd0;
  int local_1ccc;
  int local_1cc8;
  int local_1cc4;
  parasail_result_t *local_1cc0;
  int64_t *local_1cb8;
  int64_t *local_1cb0;
  int64_t *local_1ca8;
  int64_t *local_1ca0;
  int64_t *local_1c98;
  int64_t *local_1c90;
  int64_t *local_1c88;
  int64_t *local_1c80;
  int64_t *local_1c78;
  int64_t *local_1c70;
  int64_t *local_1c68;
  int64_t *local_1c60;
  int64_t *local_1c58;
  int64_t *local_1c50;
  int64_t *local_1c48;
  int64_t *local_1c40;
  int64_t *local_1c38;
  int64_t *local_1c30;
  int64_t *local_1c28;
  int local_1c1c;
  int local_1c18;
  int local_1c14;
  int local_1c10;
  int local_1c0c;
  int local_1c08;
  int local_1bfc;
  long local_1bf8;
  long local_1be8;
  parasail_result_t *local_1be0;
  ulong local_1bd8;
  ulong local_1bd0;
  undefined8 local_1bc8;
  undefined8 local_1bc0;
  undefined8 local_1bb8;
  undefined8 local_1bb0;
  ulong local_1ba8;
  ulong local_1ba0;
  ulong local_1b98;
  ulong local_1b90;
  ulong local_1b88;
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  undefined1 local_1ae0 [32];
  undefined1 local_1ac0 [32];
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  undefined1 local_1940 [32];
  undefined1 local_1920 [32];
  undefined1 local_1900 [32];
  undefined1 local_18e0 [32];
  undefined1 local_18c0 [16];
  undefined1 auStack_18b0 [16];
  ulong local_18a0;
  ulong local_1898;
  ulong local_1890;
  ulong local_1888;
  undefined1 local_1880 [16];
  undefined1 auStack_1870 [16];
  ulong local_1860;
  ulong local_1858;
  ulong local_1850;
  ulong local_1848;
  undefined1 local_1840 [16];
  undefined1 auStack_1830 [16];
  ulong local_1820;
  ulong local_1818;
  ulong local_1810;
  ulong local_1808;
  undefined1 local_1800 [16];
  undefined1 auStack_17f0 [16];
  ulong local_17e0;
  ulong local_17d8;
  ulong local_17d0;
  ulong local_17c8;
  undefined1 local_17c0 [16];
  undefined1 auStack_17b0 [16];
  ulong local_17a0;
  ulong local_1798;
  ulong local_1790;
  ulong local_1788;
  undefined1 local_1780 [16];
  undefined1 auStack_1770 [16];
  undefined8 local_1760;
  undefined8 local_1758;
  undefined8 local_1750;
  undefined8 local_1748;
  undefined1 local_1740 [16];
  undefined1 auStack_1730 [16];
  undefined8 local_1720;
  undefined8 local_1718;
  undefined8 local_1710;
  undefined8 local_1708;
  undefined1 local_1700 [16];
  undefined1 auStack_16f0 [16];
  undefined8 local_16e0;
  undefined8 local_16d8;
  undefined8 local_16d0;
  undefined8 local_16c8;
  undefined1 local_16c0 [16];
  undefined1 auStack_16b0 [16];
  undefined8 local_16a0;
  undefined8 local_1698;
  undefined8 local_1690;
  undefined8 local_1688;
  undefined1 local_1680 [16];
  undefined1 auStack_1670 [16];
  ulong local_1660;
  ulong local_1658;
  ulong local_1650;
  ulong local_1648;
  undefined1 local_1640 [32];
  ulong local_1620;
  ulong local_1618;
  ulong local_1610;
  ulong local_1608;
  undefined1 local_1600 [16];
  undefined1 auStack_15f0 [16];
  ulong local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  undefined1 local_15c0 [32];
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  undefined1 local_1580 [16];
  undefined1 auStack_1570 [16];
  undefined8 local_1560;
  undefined8 local_1558;
  undefined8 local_1550;
  undefined8 local_1548;
  undefined1 local_1540 [16];
  undefined1 auStack_1530 [16];
  undefined8 local_1520;
  undefined8 local_1518;
  undefined8 local_1510;
  undefined8 local_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  long local_1480;
  long lStack_1478;
  long lStack_1470;
  long lStack_1468;
  long local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  ulong local_1440;
  long lStack_1438;
  long lStack_1430;
  long lStack_1428;
  ulong local_1420;
  long lStack_1418;
  long lStack_1410;
  long lStack_1408;
  long local_1400;
  long lStack_13f8;
  long lStack_13f0;
  long lStack_13e8;
  undefined1 local_13e0 [16];
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  long local_13c0;
  long lStack_13b8;
  long lStack_13b0;
  long lStack_13a8;
  long local_13a0;
  long lStack_1398;
  long lStack_1390;
  long lStack_1388;
  long local_1380;
  long lStack_1378;
  long lStack_1370;
  long lStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  long local_12e0;
  long lStack_12d8;
  long lStack_12d0;
  long lStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  int64_t iStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  int64_t iStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  long local_1160;
  long lStack_1158;
  long lStack_1150;
  long lStack_1148;
  long local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  long local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  int64_t local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  ulong local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  int64_t local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  ulong local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  int64_t local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  ulong local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  long local_f80;
  long lStack_f78;
  long lStack_f70;
  long lStack_f68;
  long local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  long local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  int64_t local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  ulong local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  int64_t local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  ulong local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  int64_t local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  ulong local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  ulong local_da0;
  long lStack_d98;
  long lStack_d90;
  long lStack_d88;
  ulong local_d80;
  long lStack_d78;
  long lStack_d70;
  long lStack_d68;
  long local_d60;
  long lStack_d58;
  long lStack_d50;
  long lStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  long local_d00;
  long lStack_cf8;
  long lStack_cf0;
  long lStack_ce8;
  long local_ce0;
  long lStack_cd8;
  long lStack_cd0;
  long lStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  long local_ca0;
  long lStack_c98;
  long lStack_c90;
  long lStack_c88;
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  long local_c40;
  long lStack_c38;
  long lStack_c30;
  long lStack_c28;
  int64_t local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  long local_be0;
  long lStack_bd8;
  long lStack_bd0;
  long lStack_bc8;
  long local_bc0;
  long lStack_bb8;
  long lStack_bb0;
  long lStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  long local_b80;
  long lStack_b78;
  long lStack_b70;
  long lStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  long local_b20;
  long lStack_b18;
  long lStack_b10;
  long lStack_b08;
  int64_t local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  long local_ac0;
  long lStack_ab8;
  long lStack_ab0;
  long lStack_aa8;
  long local_aa0;
  long lStack_a98;
  long lStack_a90;
  long lStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  long local_a60;
  long lStack_a58;
  long lStack_a50;
  long lStack_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  long local_a00;
  long lStack_9f8;
  long lStack_9f0;
  long lStack_9e8;
  int64_t local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  int64_t iStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  int64_t iStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  int64_t iStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  int64_t iStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  int64_t iStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  int64_t iStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  long local_700;
  long lStack_6f8;
  long lStack_6f0;
  long lStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  ulong local_560;
  long lStack_558;
  long lStack_550;
  long lStack_548;
  ulong local_540;
  long lStack_538;
  long lStack_530;
  long lStack_528;
  long local_520;
  long lStack_518;
  long lStack_510;
  long lStack_508;
  long local_500;
  long lStack_4f8;
  long lStack_4f0;
  long lStack_4e8;
  long local_4e0;
  long lStack_4d8;
  long lStack_4d0;
  long lStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 auStack_4b0 [16];
  long local_4a0;
  long lStack_498;
  long lStack_490;
  long lStack_488;
  long local_480;
  long lStack_478;
  long lStack_470;
  long lStack_468;
  long local_460;
  long lStack_458;
  long lStack_450;
  long lStack_448;
  long local_440;
  long lStack_438;
  long lStack_430;
  long lStack_428;
  long local_420;
  long lStack_418;
  long lStack_410;
  long lStack_408;
  long local_400;
  long lStack_3f8;
  long lStack_3f0;
  long lStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  long local_3a0;
  long lStack_398;
  long lStack_390;
  long lStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  long local_240;
  long lStack_238;
  long lStack_230;
  long lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  long local_1c0;
  long lStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  long local_180;
  long lStack_178;
  long lStack_170;
  long lStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  long local_140;
  long lStack_138;
  long lStack_130;
  long lStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  long local_100;
  long lStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  long local_c0;
  long lStack_b8;
  long lStack_b0;
  long lStack_a8;
  long local_a0;
  long lStack_98;
  long lStack_90;
  long lStack_88;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_1c08 = 0;
  local_1c0c = 0;
  local_1c10 = 0;
  local_1c14 = 0;
  local_1c18 = 0;
  local_1c1c = 0;
  local_1c28 = (int64_t *)0x0;
  local_1c30 = (int64_t *)0x0;
  local_1c38 = (int64_t *)0x0;
  local_1c40 = (int64_t *)0x0;
  local_1c48 = (int64_t *)0x0;
  local_1c50 = (int64_t *)0x0;
  local_1c58 = (int64_t *)0x0;
  local_1c60 = (int64_t *)0x0;
  local_1c68 = (int64_t *)0x0;
  local_1c70 = (int64_t *)0x0;
  local_1c78 = (int64_t *)0x0;
  local_1c80 = (int64_t *)0x0;
  local_1c88 = (int64_t *)0x0;
  local_1c90 = (int64_t *)0x0;
  local_1c98 = (int64_t *)0x0;
  local_1ca0 = (int64_t *)0x0;
  local_1ca8 = (int64_t *)0x0;
  local_1cb0 = (int64_t *)0x0;
  local_1cb8 = (int64_t *)0x0;
  local_1cc0 = (parasail_result_t *)0x0;
  local_1cc4 = 0;
  local_1cc8 = 0;
  local_1ccc = 0;
  local_1cd0 = 0;
  local_1cd8 = 0;
  local_1ce0 = 0;
  local_1ce8 = 0;
  local_1cf0 = 0;
  local_1cf8 = 0;
  local_1d00 = 0;
  if (in_RDX == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_diag_avx2_256_64","_s2");
    local_1be0 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_diag_avx2_256_64","s2Len");
    local_1be0 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_diag_avx2_256_64","open");
    local_1be0 = (parasail_result_t *)0x0;
  }
  else if (in_R9D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_stats_table_diag_avx2_256_64","gap");
    local_1be0 = (parasail_result_t *)0x0;
  }
  else if (in_stack_00000008 == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_diag_avx2_256_64","matrix");
    local_1be0 = (parasail_result_t *)0x0;
  }
  else {
    if (*(int *)(in_stack_00000008 + 0x30) == 1) {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: stats functions with pssm require a consensus sequence\n",
                "parasail_sw_stats_table_diag_avx2_256_64");
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (in_RDI == 0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_sw_stats_table_diag_avx2_256_64","_s1");
        return (parasail_result_t *)0x0;
      }
      if (in_ESI < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_stats_table_diag_avx2_256_64","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_1c08 = 4;
    local_1c0c = 3;
    local_1c10 = 6;
    if (*(int *)(in_stack_00000008 + 0x30) != 0) {
      in_ESI = *(int *)(in_stack_00000008 + 0x34);
    }
    local_1c18 = in_ESI + 3;
    local_1c1c = in_ECX + 3;
    local_1cc4 = 0;
    local_1cc8 = 0;
    local_1ccc = 0;
    local_1cd0 = 0;
    if (-in_R8D < *(int *)(in_stack_00000008 + 0x20)) {
      lVar86 = (long)in_R8D;
    }
    else {
      lVar86 = -(long)*(int *)(in_stack_00000008 + 0x20);
    }
    lVar144 = lVar86 + -0x8000000000000000;
    local_1d00 = lVar86 + 0x8000000000000001;
    local_1ce0 = 0x7ffffffffffffffe - (long)*(int *)(in_stack_00000008 + 0x1c);
    auVar98._8_8_ = 0;
    auVar98._0_8_ = local_1d00;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = local_1d00;
    local_18c0 = vpunpcklqdq_avx(auVar98,auVar117);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = local_1d00;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = local_1d00;
    auStack_18b0 = vpunpcklqdq_avx(auVar118,auVar133);
    local_1d20 = local_18c0._0_8_;
    uStack_1d18 = local_18c0._8_8_;
    uStack_1d10 = auStack_18b0._0_8_;
    uStack_1d08 = auStack_18b0._8_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = local_1ce0;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = local_1ce0;
    local_1880 = vpunpcklqdq_avx(auVar99,auVar119);
    auVar120._8_8_ = 0;
    auVar120._0_8_ = local_1ce0;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_1ce0;
    auStack_1870 = vpunpcklqdq_avx(auVar120,auVar134);
    local_1d40 = local_1880._0_8_;
    uStack_1d38 = local_1880._8_8_;
    uStack_1d30 = auStack_1870._0_8_;
    uStack_1d28 = auStack_1870._8_8_;
    local_1d60 = local_1880._0_8_;
    uStack_1d58 = local_1880._8_8_;
    uStack_1d50 = auStack_1870._0_8_;
    uStack_1d48 = auStack_1870._8_8_;
    local_1d80 = local_18c0._0_8_;
    uStack_1d78 = local_18c0._8_8_;
    uStack_1d70 = auStack_18b0._0_8_;
    uStack_1d68 = auStack_18b0._8_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = local_1d00;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = local_1d00;
    local_1840 = vpunpcklqdq_avx(auVar100,auVar121);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_1d00;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = local_1d00;
    auStack_1830 = vpunpcklqdq_avx(auVar122,auVar135);
    local_1da0 = local_1840._0_8_;
    uStack_1d98 = local_1840._8_8_;
    uStack_1d90 = auStack_1830._0_8_;
    uStack_1d88 = auStack_1830._8_8_;
    auVar10._16_8_ = auStack_1830._0_8_;
    auVar10._0_16_ = local_1840;
    auVar10._24_8_ = auStack_1830._8_8_;
    local_18e0 = vpslldq_avx2(ZEXT1632(auStack_1830),8);
    local_1900 = vpsrldq_avx2(auVar10,8);
    local_1dc0 = vpor_avx2(local_18e0,local_1900);
    local_1ba0 = (ulong)in_R8D;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_1ba0;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = local_1ba0;
    local_1800 = vpunpcklqdq_avx(auVar101,auVar123);
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_1ba0;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_1ba0;
    auStack_17f0 = vpunpcklqdq_avx(auVar124,auVar136);
    local_1de0 = local_1800._0_8_;
    uStack_1dd8 = local_1800._8_8_;
    uStack_1dd0 = auStack_17f0._0_8_;
    uStack_1dc8 = auStack_17f0._8_8_;
    local_1ba8 = (ulong)in_R9D;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = local_1ba8;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_1ba8;
    local_17c0 = vpunpcklqdq_avx(auVar102,auVar125);
    auVar126._8_8_ = 0;
    auVar126._0_8_ = local_1ba8;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_1ba8;
    auStack_17b0 = vpunpcklqdq_avx(auVar126,auVar137);
    local_1e00 = local_17c0._0_8_;
    uStack_1df8 = local_17c0._8_8_;
    uStack_1df0 = auStack_17b0._0_8_;
    uStack_1de8 = auStack_17b0._8_8_;
    local_1bb0 = 0;
    local_1748 = 0;
    local_1750 = 0;
    local_1758 = 0;
    local_1760 = 0;
    local_1780 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    auStack_1770 = vpunpcklqdq_avx(ZEXT816(0),ZEXT816(0));
    local_1e20 = local_1780._0_8_;
    lStack_1e18 = local_1780._8_8_;
    lStack_1e10 = auStack_1770._0_8_;
    lStack_1e08 = auStack_1770._8_8_;
    local_1bb8 = 1;
    local_1708 = 1;
    local_1710 = 1;
    local_1718 = 1;
    local_1720 = 1;
    local_1740 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_1730 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_1e40 = local_1740._0_8_;
    uStack_1e38 = local_1740._8_8_;
    uStack_1e30 = auStack_1730._0_8_;
    uStack_1e28 = auStack_1730._8_8_;
    local_1bc0 = 4;
    local_1700 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    auStack_16f0 = vpunpcklqdq_avx(ZEXT816(4),ZEXT816(4));
    local_1e60 = local_1700._0_8_;
    uStack_1e58 = local_1700._8_8_;
    uStack_1e50 = auStack_16f0._0_8_;
    uStack_1e48 = auStack_16f0._8_8_;
    local_1bc8 = 0xffffffffffffffff;
    local_1688 = 0xffffffffffffffff;
    local_1690 = 0xffffffffffffffff;
    local_1698 = 0xffffffffffffffff;
    local_16a0 = 0xffffffffffffffff;
    local_16c0 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auStack_16b0 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    local_1e80 = local_16c0._0_8_;
    lStack_1e78 = local_16c0._8_8_;
    lStack_1e70 = auStack_16b0._0_8_;
    lStack_1e68 = auStack_16b0._8_8_;
    local_1508 = 0;
    local_1510 = 1;
    local_1518 = 2;
    local_1520 = 3;
    local_1540 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_1530 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_1ea0._16_8_ = auStack_1530._0_8_;
    local_1ea0._0_16_ = local_1540;
    local_1ea0._24_8_ = auStack_1530._8_8_;
    local_1548 = 0;
    local_1550 = 0xffffffffffffffff;
    local_1558 = 0xfffffffffffffffe;
    local_1560 = 0xfffffffffffffffd;
    local_1580 = vpunpcklqdq_avx(ZEXT816(0xfffffffffffffffd),ZEXT816(0xfffffffffffffffe));
    auStack_1570 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0));
    local_1ec0 = local_1580._0_8_;
    uStack_1eb8 = local_1580._8_8_;
    uStack_1eb0 = auStack_1570._0_8_;
    uStack_1ea8 = auStack_1570._8_8_;
    local_1ee0._16_8_ = auStack_1830._0_8_;
    local_1ee0._0_16_ = local_1840;
    local_1ee0._24_8_ = auStack_1830._8_8_;
    local_1f00._16_8_ = auStack_1830._0_8_;
    local_1f00._0_16_ = local_1840;
    local_1f00._24_8_ = auStack_1830._8_8_;
    local_1f20._16_8_ = auStack_1830._0_8_;
    local_1f20._0_16_ = local_1840;
    local_1f20._24_8_ = auStack_1830._8_8_;
    local_1f40._16_8_ = auStack_1830._0_8_;
    local_1f40._0_16_ = local_1840;
    local_1f40._24_8_ = auStack_1830._8_8_;
    local_1f60._16_8_ = auStack_1830._0_8_;
    local_1f60._0_16_ = local_1840;
    local_1f60._24_8_ = auStack_1830._8_8_;
    local_1f80._16_8_ = auStack_1830._0_8_;
    local_1f80._0_16_ = local_1840;
    local_1f80._24_8_ = auStack_1830._8_8_;
    local_1bd0 = (ulong)in_ESI;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = local_1bd0;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_1bd0;
    auVar98 = vpunpcklqdq_avx(auVar103,auVar127);
    auVar128._8_8_ = 0;
    auVar128._0_8_ = local_1bd0;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = local_1bd0;
    auStack_1670 = vpunpcklqdq_avx(auVar128,auVar138);
    local_1680._0_8_ = auVar98._0_8_;
    uVar78 = local_1680._0_8_;
    local_1680._8_8_ = auVar98._8_8_;
    uVar79 = local_1680._8_8_;
    uVar80 = auStack_1670._0_8_;
    uVar81 = auStack_1670._8_8_;
    local_1bd8 = (ulong)in_ECX;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = local_1bd8;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = local_1bd8;
    auVar99 = vpunpcklqdq_avx(auVar104,auVar129);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = local_1bd8;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = local_1bd8;
    auVar100 = vpunpcklqdq_avx(auVar105,auVar139);
    auVar109._0_16_ = ZEXT116(0) * auVar99 + ZEXT116(1) * auVar100;
    auVar109._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar99;
    local_1cf8 = local_1d00;
    local_1cf0 = local_1d00;
    local_1ce8 = local_1d00;
    local_1cd8 = local_1d00;
    local_1c14 = in_ESI;
    local_1bfc = in_ECX;
    local_1bf8 = in_RDX;
    local_1be8 = in_RDI;
    local_1b98 = local_1d00;
    local_1b90 = local_1ce0;
    local_1b88 = local_1d00;
    local_18a0 = local_1d00;
    local_1898 = local_1d00;
    local_1890 = local_1d00;
    local_1888 = local_1d00;
    local_1860 = local_1ce0;
    local_1858 = local_1ce0;
    local_1850 = local_1ce0;
    local_1848 = local_1ce0;
    local_1820 = local_1d00;
    local_1818 = local_1d00;
    local_1810 = local_1d00;
    local_1808 = local_1d00;
    local_17e0 = local_1ba0;
    local_17d8 = local_1ba0;
    local_17d0 = local_1ba0;
    local_17c8 = local_1ba0;
    local_17a0 = local_1ba8;
    local_1798 = local_1ba8;
    local_1790 = local_1ba8;
    local_1788 = local_1ba8;
    local_16e0 = local_1bc0;
    local_16d8 = local_1bc0;
    local_16d0 = local_1bc0;
    local_16c8 = local_1bc0;
    local_1680 = auVar98;
    local_1660 = local_1bd0;
    local_1658 = local_1bd0;
    local_1650 = local_1bd0;
    local_1648 = local_1bd0;
    local_1640 = auVar109;
    local_1620 = local_1bd8;
    local_1618 = local_1bd8;
    local_1610 = local_1bd8;
    local_1608 = local_1bd8;
    local_1cc0 = parasail_result_new_table3(in_ESI,in_ECX);
    if (local_1cc0 == (parasail_result_t *)0x0) {
      local_1be0 = (parasail_result_t *)0x0;
    }
    else {
      local_1cc0->flag = local_1cc0->flag | 0x4811004;
      local_1cc0->flag = local_1cc0->flag | 0x20000;
      local_1c28 = parasail_memalign_int64_t(0x20,(long)(local_1c14 + local_1c0c));
      local_1c30 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c38 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c40 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c48 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c50 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c58 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c60 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c68 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c70 = parasail_memalign_int64_t(0x20,(long)(local_1bfc + local_1c10));
      local_1c78 = local_1c30 + local_1c0c;
      local_1c80 = local_1c38 + local_1c0c;
      local_1c88 = local_1c40 + local_1c0c;
      local_1c90 = local_1c48 + local_1c0c;
      local_1c98 = local_1c50 + local_1c0c;
      local_1ca0 = local_1c58 + local_1c0c;
      local_1ca8 = local_1c60 + local_1c0c;
      local_1cb0 = local_1c68 + local_1c0c;
      local_1cb8 = local_1c70 + local_1c0c;
      if (local_1c28 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c30 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c38 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c40 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c48 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c50 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c58 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c60 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c68 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else if (local_1c70 == (int64_t *)0x0) {
        local_1be0 = (parasail_result_t *)0x0;
      }
      else {
        for (local_1cc4 = 0; local_1cc4 < local_1c14; local_1cc4 = local_1cc4 + 1) {
          local_1c28[local_1cc4] =
               (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                             (ulong)*(byte *)(local_1be8 + local_1cc4) * 4);
        }
        for (local_1cc4 = local_1c14; local_1cc4 < local_1c18; local_1cc4 = local_1cc4 + 1) {
          local_1c28[local_1cc4] = 0;
        }
        for (local_1cc8 = 0; local_1cc8 < local_1bfc; local_1cc8 = local_1cc8 + 1) {
          local_1c78[local_1cc8] =
               (long)*(int *)(*(long *)(in_stack_00000008 + 0x10) +
                             (ulong)*(byte *)(local_1bf8 + local_1cc8) * 4);
        }
        for (local_1cc8 = -local_1c0c; local_1cc8 < 0; local_1cc8 = local_1cc8 + 1) {
          local_1c78[local_1cc8] = 0;
        }
        for (local_1cc8 = local_1bfc; local_1cc8 < local_1c1c; local_1cc8 = local_1cc8 + 1) {
          local_1c78[local_1cc8] = 0;
        }
        for (local_1cc8 = 0; local_1cc8 < local_1bfc; local_1cc8 = local_1cc8 + 1) {
          local_1c80[local_1cc8] = 0;
          local_1c88[local_1cc8] = 0;
          local_1c90[local_1cc8] = 0;
          local_1c98[local_1cc8] = 0;
          local_1ca0[local_1cc8] = local_1cd8;
          local_1ca8[local_1cc8] = 0;
          local_1cb0[local_1cc8] = 0;
          local_1cb8[local_1cc8] = 0;
        }
        for (local_1cc8 = -local_1c0c; local_1cc8 < 0; local_1cc8 = local_1cc8 + 1) {
          local_1c80[local_1cc8] = local_1cd8;
          local_1c88[local_1cc8] = 0;
          local_1c90[local_1cc8] = 0;
          local_1c98[local_1cc8] = 0;
          local_1ca0[local_1cc8] = local_1cd8;
          local_1ca8[local_1cc8] = 0;
          local_1cb0[local_1cc8] = 0;
          local_1cb8[local_1cc8] = 0;
        }
        for (local_1cc8 = local_1bfc; local_1cc8 < local_1bfc + local_1c0c;
            local_1cc8 = local_1cc8 + 1) {
          local_1c80[local_1cc8] = local_1cd8;
          local_1c88[local_1cc8] = 0;
          local_1c90[local_1cc8] = 0;
          local_1c98[local_1cc8] = 0;
          local_1ca0[local_1cc8] = local_1cd8;
          local_1ca8[local_1cc8] = 0;
          local_1cb0[local_1cc8] = 0;
          local_1cb8[local_1cc8] = 0;
        }
        local_1c80[-1] = 0;
        for (local_1cc4 = 0; local_1cc4 < local_1c14; local_1cc4 = local_1c08 + local_1cc4) {
          local_2040 = local_1dc0;
          local_2060._8_8_ = lStack_1e18;
          local_2060._0_8_ = local_1e20;
          local_2060._16_8_ = lStack_1e10;
          local_2060._24_8_ = lStack_1e08;
          local_2080._8_8_ = lStack_1e18;
          local_2080._0_8_ = local_1e20;
          local_2080._16_8_ = lStack_1e10;
          local_2080._24_8_ = lStack_1e08;
          local_20a0._8_8_ = lStack_1e18;
          local_20a0._0_8_ = local_1e20;
          local_20a0._16_8_ = lStack_1e10;
          local_20a0._24_8_ = lStack_1e08;
          _local_20c0 = local_1dc0;
          local_20e0._8_8_ = lStack_1e18;
          local_20e0._0_8_ = local_1e20;
          local_20e0._16_8_ = lStack_1e10;
          lStack_20c8 = lStack_1e08;
          local_2100._8_8_ = lStack_1e18;
          local_2100._0_8_ = local_1e20;
          local_2100._16_8_ = lStack_1e10;
          lStack_20e8 = lStack_1e08;
          local_2120._8_8_ = lStack_1e18;
          local_2120._0_8_ = local_1e20;
          local_2120._16_8_ = lStack_1e10;
          lStack_2108 = lStack_1e08;
          local_2140._8_8_ = uStack_1d98;
          local_2140._0_8_ = local_1da0;
          local_2140._16_8_ = uStack_1d90;
          local_2140._24_8_ = uStack_1d88;
          local_21a0._8_8_ = lStack_1e18;
          local_21a0._0_8_ = local_1e20;
          local_21a0._16_8_ = lStack_1e10;
          local_21a0._24_8_ = lStack_1e08;
          local_21c0._8_8_ = lStack_1e18;
          local_21c0._0_8_ = local_1e20;
          local_21c0._16_8_ = lStack_1e10;
          local_21c0._24_8_ = lStack_1e08;
          local_21e0._8_8_ = lStack_1e18;
          local_21e0._0_8_ = local_1e20;
          local_21e0._16_8_ = lStack_1e10;
          local_21e0._24_8_ = lStack_1e08;
          local_2200._8_8_ = uStack_1d98;
          local_2200._0_8_ = local_1da0;
          local_2200._16_8_ = uStack_1d90;
          lStack_21e8 = uStack_1d88;
          local_2260._8_8_ = lStack_1e18;
          local_2260._0_8_ = local_1e20;
          local_2260._16_8_ = lStack_1e10;
          lStack_2248 = lStack_1e08;
          local_2280._8_8_ = lStack_1e18;
          local_2280._0_8_ = local_1e20;
          local_2280._16_8_ = lStack_1e10;
          lStack_2268 = lStack_1e08;
          local_22a0._8_8_ = lStack_1e18;
          local_22a0._0_8_ = local_1e20;
          local_22a0._16_8_ = lStack_1e10;
          lStack_2288 = lStack_1e08;
          local_22c0._8_8_ = uStack_1eb8;
          local_22c0._0_8_ = local_1ec0;
          local_22c0._16_8_ = uStack_1eb0;
          local_22c0._24_8_ = uStack_1ea8;
          lVar86 = (long)local_1cc4;
          local_1588 = local_1c28[lVar86];
          local_1590 = local_1c28[lVar86 + 1];
          local_1598 = local_1c28[lVar86 + 2];
          local_15a0 = local_1c28[lVar86 + 3];
          auVar106._8_8_ = 0;
          auVar106._0_8_ = local_1590;
          auVar130._8_8_ = 0;
          auVar130._0_8_ = local_1588;
          auVar99 = vpunpcklqdq_avx(auVar106,auVar130);
          auVar107._8_8_ = 0;
          auVar107._0_8_ = local_15a0;
          auVar140._8_8_ = 0;
          auVar140._0_8_ = local_1598;
          auVar100 = vpunpcklqdq_avx(auVar107,auVar140);
          auVar110._0_16_ = ZEXT116(0) * auVar99 + ZEXT116(1) * auVar100;
          auVar110._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar99;
          local_2300._8_8_ = uStack_1d98;
          local_2300._0_8_ = local_1da0;
          local_2300._16_8_ = uStack_1d90;
          lStack_22e8 = uStack_1d88;
          lVar86 = *(long *)(in_stack_00000008 + 8);
          lVar87 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar88 = local_1c28[local_1cc4];
          }
          else {
            in_stack_ffffffffffffdae4 = local_1cc4;
            if (local_1c14 <= local_1cc4) {
              in_stack_ffffffffffffdae4 = local_1c14 + -1;
            }
            iVar88 = (int64_t)in_stack_ffffffffffffdae4;
          }
          lVar89 = lVar86 + lVar87 * iVar88 * 4;
          lVar2 = *(long *)(in_stack_00000008 + 8);
          lVar90 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            local_2538 = local_1c28[local_1cc4 + 1];
          }
          else {
            if (local_1cc4 + 1 < local_1c14) {
              in_stack_ffffffffffffdac4 = local_1cc4 + 1;
            }
            else {
              in_stack_ffffffffffffdac4 = local_1c14 + -1;
            }
            local_2538 = (long)in_stack_ffffffffffffdac4;
          }
          lVar95 = lVar90 * local_2538;
          lVar143 = *(long *)(in_stack_00000008 + 8);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar91 = local_1c28[local_1cc4 + 2];
          }
          else {
            if (local_1cc4 + 2 < local_1c14) {
              in_stack_ffffffffffffdaa4 = local_1cc4 + 2;
            }
            else {
              in_stack_ffffffffffffdaa4 = local_1c14 + -1;
            }
            iVar91 = (int64_t)in_stack_ffffffffffffdaa4;
          }
          lVar92 = lVar143 + *(int *)(in_stack_00000008 + 0x18) * iVar91 * 4;
          lVar142 = *(long *)(in_stack_00000008 + 8);
          lVar93 = (long)*(int *)(in_stack_00000008 + 0x18);
          if (*(int *)(in_stack_00000008 + 0x30) == 0) {
            iVar94 = local_1c28[local_1cc4 + 3];
          }
          else {
            if (local_1cc4 + 3 < local_1c14) {
              local_257c = local_1cc4 + 3;
            }
            else {
              local_257c = local_1c14 + -1;
            }
            iVar94 = (int64_t)local_257c;
          }
          lVar1 = lVar142 + lVar93 * iVar94 * 4;
          local_12a0 = uVar78;
          uStack_1298 = uVar79;
          uStack_1290 = uVar80;
          uStack_1288 = uVar81;
          local_12c0 = local_1ea0._0_8_;
          uStack_12b8 = local_1ea0._8_8_;
          uStack_12b0 = local_1ea0._16_8_;
          uStack_12a8 = local_1ea0._24_8_;
          auVar9._16_8_ = uVar80;
          auVar9._0_16_ = auVar98;
          auVar9._24_8_ = uVar81;
          auVar10 = vpcmpgtq_avx2(auVar9,local_1ea0);
          local_1cc8 = 0;
          local_15c0 = auVar110;
          while( true ) {
            auVar6 = local_2040;
            auVar7 = local_2060;
            auVar8 = local_2080;
            auVar9 = local_20a0;
            lStack_22c8 = auVar110._24_8_;
            lStack_22d0 = auVar110._16_8_;
            lStack_22d8 = auVar110._8_8_;
            local_22e0 = auVar110._0_8_;
            uStack_1fa8 = auVar109._24_8_;
            uStack_1fb0 = auVar109._16_8_;
            if (local_1bfc + local_1c0c <= local_1cc8) break;
            uVar75 = local_2040._0_8_;
            uVar77 = local_2040._24_8_;
            uVar70 = local_2060._0_8_;
            uVar72 = local_2060._8_8_;
            uVar73 = local_2060._16_8_;
            uVar74 = local_2060._24_8_;
            uVar65 = local_2080._0_8_;
            uVar67 = local_2080._8_8_;
            uVar68 = local_2080._16_8_;
            uVar69 = local_2080._24_8_;
            uVar60 = local_20a0._0_8_;
            uVar62 = local_20a0._8_8_;
            uVar63 = local_20a0._16_8_;
            uVar64 = local_20a0._24_8_;
            local_1920 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdf50),8);
            local_1940 = vpsrldq_avx2(_local_20c0,8);
            auVar11 = vpor_avx2(local_1920,local_1940);
            iStack_1188 = local_1c80[local_1cc8];
            local_2040._0_24_ = auVar11._0_24_;
            auVar76 = local_2040._0_24_;
            local_2040._24_8_ = iStack_1188;
            auVar22 = local_2040;
            local_1960 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdf30),8);
            local_1980 = vpsrldq_avx2(_local_20e0,8);
            auVar12 = vpor_avx2(local_1960,local_1980);
            local_2060._24_8_ = local_1c88[local_1cc8];
            local_2060._0_24_ = auVar12._0_24_;
            auVar71 = local_2060._0_24_;
            auVar21 = local_2060;
            local_19a0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdf10),8);
            local_19c0 = vpsrldq_avx2(_local_2100,8);
            auVar13 = vpor_avx2(local_19a0,local_19c0);
            local_2080._24_8_ = local_1c90[local_1cc8];
            local_2080._0_24_ = auVar13._0_24_;
            auVar66 = local_2080._0_24_;
            auVar20 = local_2080;
            local_19e0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdef0),8);
            local_1a00 = vpsrldq_avx2(_local_2120,8);
            auVar14 = vpor_avx2(local_19e0,local_1a00);
            local_20a0._24_8_ = local_1c98[local_1cc8];
            local_20a0._0_24_ = auVar14._0_24_;
            auVar61 = local_20a0._0_24_;
            auVar19 = local_20a0;
            local_1a20 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffde10),8);
            local_1a40 = vpsrldq_avx2(_local_2200,8);
            auVar15 = vpor_avx2(local_1a20,local_1a40);
            iStack_11c8 = local_1ca0[local_1cc8];
            local_1a60 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffddb0),8);
            local_1a80 = vpsrldq_avx2(_local_2260,8);
            auVar16 = vpor_avx2(local_1a60,local_1a80);
            iVar3 = local_1ca8[local_1cc8];
            local_1aa0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdd90),8);
            local_1ac0 = vpsrldq_avx2(_local_2280,8);
            auVar17 = vpor_avx2(local_1aa0,local_1ac0);
            iVar4 = local_1cb0[local_1cc8];
            local_1ae0 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdd70),8);
            local_1b00 = vpsrldq_avx2(_local_22a0,8);
            auVar18 = vpor_avx2(local_1ae0,local_1b00);
            iVar5 = local_1cb8[local_1cc8];
            local_2040._0_8_ = auVar11._0_8_;
            local_2040._8_8_ = auVar11._8_8_;
            local_2040._16_8_ = auVar11._16_8_;
            local_11a0 = local_2040._0_8_;
            uStack_1198 = local_2040._8_8_;
            uStack_1190 = local_2040._16_8_;
            local_11c0 = local_1de0;
            uStack_11b8 = uStack_1dd8;
            uStack_11b0 = uStack_1dd0;
            uStack_11a8 = uStack_1dc8;
            auVar27._24_8_ = iStack_1188;
            auVar27._0_24_ = auVar76;
            auVar26._8_8_ = uStack_1dd8;
            auVar26._0_8_ = local_1de0;
            auVar26._16_8_ = uStack_1dd0;
            auVar26._24_8_ = uStack_1dc8;
            auVar11 = vpsubq_avx2(auVar27,auVar26);
            local_2200._0_8_ = auVar15._0_8_;
            local_2200._8_8_ = auVar15._8_8_;
            local_2200._16_8_ = auVar15._16_8_;
            local_11e0 = local_2200._0_8_;
            uStack_11d8 = local_2200._8_8_;
            uStack_11d0 = local_2200._16_8_;
            local_1200 = local_1e00;
            uStack_11f8 = uStack_1df8;
            uStack_11f0 = uStack_1df0;
            uStack_11e8 = uStack_1de8;
            auVar25._24_8_ = iStack_11c8;
            auVar25._0_24_ = auVar15._0_24_;
            auVar15._8_8_ = uStack_1df8;
            auVar15._0_8_ = local_1e00;
            auVar15._16_8_ = uStack_1df0;
            auVar15._24_8_ = uStack_1de8;
            auVar15 = vpsubq_avx2(auVar25,auVar15);
            local_2220 = auVar11._0_8_;
            lStack_2218 = auVar11._8_8_;
            lStack_2210 = auVar11._16_8_;
            lStack_2208 = auVar11._24_8_;
            a[1] = lVar144;
            a[0] = lVar87;
            a[2]._0_4_ = in_ESI;
            a[2]._4_4_ = in_stack_ffffffffffffdb0c;
            a[3] = in_stack_ffffffffffffdb10;
            b[1]._0_4_ = in_stack_ffffffffffffdae0;
            b[0] = lVar90;
            b[1]._4_4_ = in_stack_ffffffffffffdae4;
            b[2] = iVar88;
            b[3] = lVar86;
            local_2200._0_8_ = local_2220;
            local_2200._8_8_ = lStack_2218;
            local_2200._16_8_ = lStack_2210;
            lStack_21e8 = lStack_2208;
            _mm256_max_epi64_rpl(a,b);
            local_2240 = auVar15._0_8_;
            uStack_2238 = auVar15._8_8_;
            uStack_2230 = auVar15._16_8_;
            uStack_2228 = auVar15._24_8_;
            local_12e0 = local_2220;
            lStack_12d8 = lStack_2218;
            lStack_12d0 = lStack_2210;
            lStack_12c8 = lStack_2208;
            local_1300 = local_2240;
            uStack_12f8 = uStack_2238;
            uStack_12f0 = uStack_2230;
            uStack_12e8 = uStack_2228;
            auVar11 = vpcmpgtq_avx2(auVar11,auVar15);
            local_2260._0_8_ = auVar16._0_8_;
            local_2260._8_8_ = auVar16._8_8_;
            local_2260._16_8_ = auVar16._16_8_;
            local_2060._0_8_ = auVar12._0_8_;
            local_2060._8_8_ = auVar12._8_8_;
            local_2060._16_8_ = auVar12._16_8_;
            local_1fe0._0_8_ = auVar11._0_8_;
            local_1fe0._8_8_ = auVar11._8_8_;
            uStack_1fd0 = auVar11._16_8_;
            uStack_1fc8 = auVar11._24_8_;
            local_780 = local_2260._0_8_;
            uStack_778 = local_2260._8_8_;
            uStack_770 = local_2260._16_8_;
            local_7a0 = local_2060._0_8_;
            uStack_798 = local_2060._8_8_;
            uStack_790 = local_2060._16_8_;
            local_7c0 = local_1fe0._0_8_;
            uStack_7b8 = local_1fe0._8_8_;
            uStack_7b0 = uStack_1fd0;
            uStack_7a8 = uStack_1fc8;
            auVar43._24_8_ = iVar3;
            auVar43._0_24_ = auVar16._0_24_;
            auVar42._24_8_ = local_2060._24_8_;
            auVar42._0_24_ = auVar71;
            _local_2260 = vpblendvb_avx2(auVar43,auVar42,auVar11);
            local_2280._0_8_ = auVar17._0_8_;
            local_2280._8_8_ = auVar17._8_8_;
            local_2280._16_8_ = auVar17._16_8_;
            local_2080._0_8_ = auVar13._0_8_;
            local_2080._8_8_ = auVar13._8_8_;
            local_2080._16_8_ = auVar13._16_8_;
            local_7e0 = local_2280._0_8_;
            uStack_7d8 = local_2280._8_8_;
            uStack_7d0 = local_2280._16_8_;
            local_800 = local_2080._0_8_;
            uStack_7f8 = local_2080._8_8_;
            uStack_7f0 = local_2080._16_8_;
            local_820 = local_1fe0._0_8_;
            uStack_818 = local_1fe0._8_8_;
            uStack_810 = uStack_1fd0;
            uStack_808 = uStack_1fc8;
            auVar41._24_8_ = iVar4;
            auVar41._0_24_ = auVar17._0_24_;
            auVar40._24_8_ = local_2080._24_8_;
            auVar40._0_24_ = auVar66;
            _local_2280 = vpblendvb_avx2(auVar41,auVar40,auVar11);
            local_22a0._0_8_ = auVar18._0_8_;
            local_22a0._8_8_ = auVar18._8_8_;
            local_22a0._16_8_ = auVar18._16_8_;
            local_20a0._0_8_ = auVar14._0_8_;
            local_20a0._8_8_ = auVar14._8_8_;
            local_20a0._16_8_ = auVar14._16_8_;
            local_840 = local_22a0._0_8_;
            uStack_838 = local_22a0._8_8_;
            uStack_830 = local_22a0._16_8_;
            local_860 = local_20a0._0_8_;
            uStack_858 = local_20a0._8_8_;
            uStack_850 = local_20a0._16_8_;
            local_880 = local_1fe0._0_8_;
            uStack_878 = local_1fe0._8_8_;
            uStack_870 = uStack_1fd0;
            uStack_868 = uStack_1fc8;
            auVar39._24_8_ = iVar5;
            auVar39._0_24_ = auVar18._0_24_;
            auVar13._24_8_ = local_20a0._24_8_;
            auVar13._0_24_ = auVar61;
            auVar11 = vpblendvb_avx2(auVar39,auVar13,auVar11);
            local_22a0._0_8_ = auVar11._0_8_;
            local_22a0._8_8_ = auVar11._8_8_;
            local_22a0._16_8_ = auVar11._16_8_;
            lStack_2288 = auVar11._24_8_;
            local_580 = local_22a0._0_8_;
            uStack_578 = local_22a0._8_8_;
            uStack_570 = local_22a0._16_8_;
            uStack_568 = lStack_2288;
            local_5a0 = local_1e40;
            uStack_598 = uStack_1e38;
            uStack_590 = uStack_1e30;
            uStack_588 = uStack_1e28;
            auVar48._8_8_ = uStack_1e38;
            auVar48._0_8_ = local_1e40;
            auVar48._16_8_ = uStack_1e30;
            auVar48._24_8_ = uStack_1e28;
            _local_22a0 = vpaddq_avx2(auVar11,auVar48);
            local_1220 = local_20c0._0_8_;
            uStack_1218 = local_20c0._8_8_;
            uStack_1210 = local_20c0._16_8_;
            uStack_1208 = lStack_20a8;
            local_1240 = local_1de0;
            uStack_1238 = uStack_1dd8;
            uStack_1230 = uStack_1dd0;
            uStack_1228 = uStack_1dc8;
            auVar11._8_8_ = uStack_1dd8;
            auVar11._0_8_ = local_1de0;
            auVar11._16_8_ = uStack_1dd0;
            auVar11._24_8_ = uStack_1dc8;
            auVar11 = vpsubq_avx2(_local_20c0,auVar11);
            local_1260 = local_2140._0_8_;
            uStack_1258 = local_2140._8_8_;
            uStack_1250 = local_2140._16_8_;
            uStack_1248 = local_2140._24_8_;
            local_1280 = local_1e00;
            uStack_1278 = uStack_1df8;
            uStack_1270 = uStack_1df0;
            uStack_1268 = uStack_1de8;
            auVar12._8_8_ = uStack_1df8;
            auVar12._0_8_ = local_1e00;
            auVar12._16_8_ = uStack_1df0;
            auVar12._24_8_ = uStack_1de8;
            auVar12 = vpsubq_avx2(local_2140,auVar12);
            local_2160 = auVar11._0_8_;
            uStack_2158 = auVar11._8_8_;
            uStack_2150 = auVar11._16_8_;
            uStack_2148 = auVar11._24_8_;
            a_00[1] = lVar144;
            a_00[0] = lVar87;
            a_00[2]._0_4_ = in_ESI;
            a_00[2]._4_4_ = in_stack_ffffffffffffdb0c;
            a_00[3] = in_stack_ffffffffffffdb10;
            b_00[1]._0_4_ = in_stack_ffffffffffffdae0;
            b_00[0] = lVar90;
            b_00[1]._4_4_ = in_stack_ffffffffffffdae4;
            b_00[2] = iVar88;
            b_00[3] = lVar86;
            uVar96 = local_2160;
            uVar111 = uStack_2158;
            uVar113 = uStack_2150;
            uVar115 = uStack_2148;
            iStack_848 = local_20a0._24_8_;
            iStack_828 = iVar5;
            iStack_7e8 = local_2080._24_8_;
            iStack_7c8 = iVar4;
            iStack_788 = local_2060._24_8_;
            iStack_768 = iVar3;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_2140._8_8_ = uVar111;
            local_2140._0_8_ = uVar96;
            local_2180 = auVar12._0_8_;
            uStack_2178 = auVar12._8_8_;
            uStack_2170 = auVar12._16_8_;
            uStack_2168 = auVar12._24_8_;
            local_1320 = local_2160;
            uStack_1318 = uStack_2158;
            uStack_1310 = uStack_2150;
            uStack_1308 = uStack_2148;
            local_1340 = local_2180;
            uStack_1338 = uStack_2178;
            uStack_1330 = uStack_2170;
            uStack_1328 = uStack_2168;
            auVar11 = vpcmpgtq_avx2(auVar11,auVar12);
            local_1fe0._0_8_ = auVar11._0_8_;
            local_1fe0._8_8_ = auVar11._8_8_;
            uStack_1fd0 = auVar11._16_8_;
            uStack_1fc8 = auVar11._24_8_;
            local_8a0 = local_21a0._0_8_;
            uStack_898 = local_21a0._8_8_;
            uStack_890 = local_21a0._16_8_;
            uStack_888 = local_21a0._24_8_;
            local_8c0 = local_20e0._0_8_;
            uStack_8b8 = local_20e0._8_8_;
            uStack_8b0 = local_20e0._16_8_;
            uStack_8a8 = lStack_20c8;
            local_8e0 = local_1fe0._0_8_;
            uStack_8d8 = local_1fe0._8_8_;
            uStack_8d0 = uStack_1fd0;
            uStack_8c8 = uStack_1fc8;
            auVar12 = vpblendvb_avx2(local_21a0,_local_20e0,auVar11);
            local_900 = local_21c0._0_8_;
            uStack_8f8 = local_21c0._8_8_;
            uStack_8f0 = local_21c0._16_8_;
            uStack_8e8 = local_21c0._24_8_;
            local_920 = local_2100._0_8_;
            uStack_918 = local_2100._8_8_;
            uStack_910 = local_2100._16_8_;
            uStack_908 = lStack_20e8;
            local_940 = local_1fe0._0_8_;
            uStack_938 = local_1fe0._8_8_;
            uStack_930 = uStack_1fd0;
            uStack_928 = uStack_1fc8;
            auVar13 = vpblendvb_avx2(local_21c0,_local_2100,auVar11);
            local_960 = local_21e0._0_8_;
            uStack_958 = local_21e0._8_8_;
            uStack_950 = local_21e0._16_8_;
            uStack_948 = local_21e0._24_8_;
            local_980 = local_2120._0_8_;
            uStack_978 = local_2120._8_8_;
            uStack_970 = local_2120._16_8_;
            uStack_968 = lStack_2108;
            local_9a0 = local_1fe0._0_8_;
            uStack_998 = local_1fe0._8_8_;
            uStack_990 = uStack_1fd0;
            uStack_988 = uStack_1fc8;
            auVar11 = vpblendvb_avx2(local_21e0,_local_2120,auVar11);
            local_21e0._0_8_ = auVar11._0_8_;
            local_21e0._8_8_ = auVar11._8_8_;
            local_21e0._16_8_ = auVar11._16_8_;
            local_21e0._24_8_ = auVar11._24_8_;
            local_5c0 = local_21e0._0_8_;
            uStack_5b8 = local_21e0._8_8_;
            uStack_5b0 = local_21e0._16_8_;
            uStack_5a8 = local_21e0._24_8_;
            local_5e0 = local_1e40;
            uStack_5d8 = uStack_1e38;
            uStack_5d0 = uStack_1e30;
            uStack_5c8 = uStack_1e28;
            auVar47._8_8_ = uStack_1e38;
            auVar47._0_8_ = local_1e40;
            auVar47._16_8_ = uStack_1e30;
            auVar47._24_8_ = uStack_1e28;
            auVar11 = vpaddq_avx2(auVar11,auVar47);
            local_1b20 = vpslldq_avx2(ZEXT1632(stack0xffffffffffffdd10),8);
            local_1b40 = vpsrldq_avx2(_local_2300,8);
            auVar14 = vpor_avx2(local_1b20,local_1b40);
            lStack_22e8 = local_1c78[local_1cc8];
            local_2300 = auVar14._0_24_;
            auVar15 = _local_2300;
            local_15c8 = (ulong)*(int *)(lVar89 + local_1c78[local_1cc8] * 4);
            local_15d0 = (ulong)*(int *)(lVar2 + lVar95 * 4 + local_1c78[local_1cc8 + -1] * 4);
            local_15d8 = (ulong)*(int *)(lVar92 + local_1c78[local_1cc8 + -2] * 4);
            local_15e0 = (ulong)*(int *)(lVar1 + local_1c78[local_1cc8 + -3] * 4);
            auVar108._8_8_ = 0;
            auVar108._0_8_ = local_15e0;
            auVar131._8_8_ = 0;
            auVar131._0_8_ = local_15d8;
            auVar99 = vpunpcklqdq_avx(auVar108,auVar131);
            auVar132._8_8_ = 0;
            auVar132._0_8_ = local_15d0;
            auVar141._8_8_ = 0;
            auVar141._0_8_ = local_15c8;
            auStack_15f0 = vpunpcklqdq_avx(auVar132,auVar141);
            local_1600._0_8_ = auVar99._0_8_;
            uVar82 = local_1600._0_8_;
            local_1600._8_8_ = auVar99._8_8_;
            uVar83 = local_1600._8_8_;
            uVar84 = auStack_15f0._0_8_;
            uVar85 = auStack_15f0._8_8_;
            lStack_2378 = auVar6._8_8_;
            lStack_2370 = auVar6._16_8_;
            local_600 = uVar75;
            uStack_5f8 = lStack_2378;
            uStack_5f0 = lStack_2370;
            uStack_5e8 = uVar77;
            local_620 = local_1600._0_8_;
            uStack_618 = local_1600._8_8_;
            uStack_610 = auStack_15f0._0_8_;
            uStack_608 = auStack_15f0._8_8_;
            auVar46._16_8_ = auStack_15f0._0_8_;
            auVar46._0_16_ = auVar99;
            auVar46._24_8_ = auStack_15f0._8_8_;
            auVar6 = vpaddq_avx2(auVar6,auVar46);
            local_2380 = auVar6._0_8_;
            lStack_2378 = auVar6._8_8_;
            lStack_2370 = auVar6._16_8_;
            lStack_2368 = auVar6._24_8_;
            a_01[1] = lVar144;
            a_01[0] = lVar87;
            a_01[2]._0_4_ = in_ESI;
            a_01[2]._4_4_ = in_stack_ffffffffffffdb0c;
            a_01[3] = in_stack_ffffffffffffdb10;
            b_01[1]._0_4_ = in_stack_ffffffffffffdae0;
            b_01[0] = lVar90;
            b_01[1]._4_4_ = in_stack_ffffffffffffdae4;
            b_01[2] = iVar88;
            b_01[3] = lVar86;
            lVar97 = local_2380;
            lVar112 = lStack_2378;
            lVar114 = lStack_2370;
            lVar116 = lStack_2368;
            local_1600 = auVar99;
            _mm256_max_epi64_rpl(a_01,b_01);
            a_02[1] = lVar144;
            a_02[0] = lVar87;
            a_02[2]._0_4_ = in_ESI;
            a_02[2]._4_4_ = in_stack_ffffffffffffdb0c;
            a_02[3] = in_stack_ffffffffffffdb10;
            b_02[1]._0_4_ = in_stack_ffffffffffffdae0;
            b_02[0] = lVar90;
            b_02[1]._4_4_ = in_stack_ffffffffffffdae4;
            b_02[2] = iVar88;
            b_02[3] = lVar86;
            _mm256_max_epi64_rpl(a_02,b_02);
            a_03[1] = lVar144;
            a_03[0] = lVar87;
            a_03[2]._0_4_ = in_ESI;
            a_03[2]._4_4_ = in_stack_ffffffffffffdb0c;
            a_03[3] = in_stack_ffffffffffffdb10;
            b_03[1]._0_4_ = in_stack_ffffffffffffdae0;
            b_03[0] = lVar90;
            b_03[1]._4_4_ = in_stack_ffffffffffffdae4;
            b_03[2] = iVar88;
            b_03[3] = lVar86;
            _mm256_max_epi64_rpl(a_03,b_03);
            local_20c0._8_8_ = lVar112;
            local_20c0._0_8_ = lVar97;
            local_420 = local_2380;
            lStack_418 = lStack_2378;
            lStack_410 = lStack_2370;
            lStack_408 = lStack_2368;
            local_ca0 = -(ulong)(lVar97 == local_2380);
            lStack_c98 = -(ulong)(lVar112 == lStack_2378);
            lStack_c90 = -(ulong)(lVar114 == lStack_2370);
            lStack_c88 = -(ulong)(lVar116 == lStack_2368);
            local_1fe0._8_8_ = lStack_c98;
            local_1fe0._0_8_ = local_ca0;
            local_c40 = -(ulong)(lVar97 == local_2200._0_8_);
            lStack_c38 = -(ulong)(lVar112 == local_2200._8_8_);
            lStack_c30 = -(ulong)(lVar114 == local_2200._16_8_);
            lStack_c28 = -(ulong)(lVar116 == lStack_21e8);
            local_4a0 = local_1e20;
            lStack_498 = lStack_1e18;
            lStack_490 = lStack_1e10;
            lStack_488 = lStack_1e08;
            local_d00 = -(ulong)(lVar97 == local_1e20);
            lStack_cf8 = -(ulong)(lVar112 == lStack_1e18);
            lStack_cf0 = -(ulong)(lVar114 == lStack_1e10);
            lStack_ce8 = -(ulong)(lVar116 == lStack_1e08);
            local_21a0._0_8_ = auVar12._0_8_;
            local_21a0._8_8_ = auVar12._8_8_;
            local_21a0._16_8_ = auVar12._16_8_;
            local_21a0._24_8_ = auVar12._24_8_;
            local_9c0 = local_21a0._0_8_;
            uStack_9b8 = local_21a0._8_8_;
            uStack_9b0 = local_21a0._16_8_;
            uStack_9a8 = local_21a0._24_8_;
            local_9e0 = local_2260._0_8_;
            uStack_9d8 = local_2260._8_8_;
            uStack_9d0 = local_2260._16_8_;
            uStack_9c8 = lStack_2248;
            auVar38._8_8_ = lStack_c38;
            auVar38._0_8_ = local_c40;
            auVar38._16_8_ = lStack_c30;
            auVar38._24_8_ = lStack_c28;
            local_a20 = vpblendvb_avx2(auVar12,_local_2260,auVar38);
            local_2300._0_8_ = auVar14._0_8_;
            local_2300._8_8_ = auVar14._8_8_;
            local_2300._16_8_ = auVar14._16_8_;
            local_4e0 = local_2300._0_8_;
            lStack_4d8 = local_2300._8_8_;
            lStack_4d0 = local_2300._16_8_;
            local_240 = -(ulong)(local_22e0 == local_2300._0_8_);
            lStack_238 = -(ulong)(lStack_22d8 == local_2300._8_8_);
            lStack_230 = -(ulong)(lStack_22d0 == local_2300._16_8_);
            lStack_228 = -(ulong)(lStack_22c8 == lStack_22e8);
            local_260 = local_1e40;
            uStack_258 = uStack_1e38;
            uStack_250 = uStack_1e30;
            uStack_248 = uStack_1e28;
            auVar52._8_8_ = lStack_238;
            auVar52._0_8_ = local_240;
            auVar52._16_8_ = lStack_230;
            auVar52._24_8_ = lStack_228;
            auVar51._8_8_ = uStack_1e38;
            auVar51._0_8_ = local_1e40;
            auVar51._16_8_ = uStack_1e30;
            auVar51._24_8_ = uStack_1e28;
            local_660 = vpand_avx2(auVar52,auVar51);
            local_640 = uVar70;
            uStack_638 = uVar72;
            uStack_630 = uVar73;
            uStack_628 = uVar74;
            local_a40 = vpaddq_avx2(auVar7,local_660);
            auVar37._16_8_ = lStack_c90;
            auVar37._0_16_ = local_1fe0;
            auVar37._24_8_ = lStack_c88;
            auVar7 = vpblendvb_avx2(local_a20,local_a40,auVar37);
            local_20e0._0_8_ = auVar7._0_8_;
            local_20e0._8_8_ = auVar7._8_8_;
            local_20e0._16_8_ = auVar7._16_8_;
            lStack_20c8 = auVar7._24_8_;
            local_a80 = local_20e0._0_8_;
            uStack_a78 = local_20e0._8_8_;
            uStack_a70 = local_20e0._16_8_;
            uStack_a68 = lStack_20c8;
            local_aa0 = local_1e20;
            lStack_a98 = lStack_1e18;
            lStack_a90 = lStack_1e10;
            lStack_a88 = lStack_1e08;
            auVar36._8_8_ = lStack_1e18;
            auVar36._0_8_ = local_1e20;
            auVar36._16_8_ = lStack_1e10;
            auVar36._24_8_ = lStack_1e08;
            auVar35._8_8_ = lStack_cf8;
            auVar35._0_8_ = local_d00;
            auVar35._16_8_ = lStack_cf0;
            auVar35._24_8_ = lStack_ce8;
            auVar7 = vpblendvb_avx2(auVar7,auVar36,auVar35);
            local_21c0._0_8_ = auVar13._0_8_;
            local_21c0._8_8_ = auVar13._8_8_;
            local_21c0._16_8_ = auVar13._16_8_;
            local_21c0._24_8_ = auVar13._24_8_;
            local_ae0 = local_21c0._0_8_;
            uStack_ad8 = local_21c0._8_8_;
            uStack_ad0 = local_21c0._16_8_;
            uStack_ac8 = local_21c0._24_8_;
            local_b00 = local_2280._0_8_;
            uStack_af8 = local_2280._8_8_;
            uStack_af0 = local_2280._16_8_;
            uStack_ae8 = lStack_2268;
            auVar34._8_8_ = lStack_c38;
            auVar34._0_8_ = local_c40;
            auVar34._16_8_ = lStack_c30;
            auVar34._24_8_ = lStack_c28;
            local_b40 = vpblendvb_avx2(auVar13,_local_2280,auVar34);
            local_1360 = uVar82;
            uStack_1358 = uVar83;
            uStack_1350 = uVar84;
            uStack_1348 = uVar85;
            local_1380 = local_1e20;
            lStack_1378 = lStack_1e18;
            lStack_1370 = lStack_1e10;
            lStack_1368 = lStack_1e08;
            auVar14._16_8_ = uVar84;
            auVar14._0_16_ = auVar99;
            auVar14._24_8_ = uVar85;
            auVar6._8_8_ = lStack_1e18;
            auVar6._0_8_ = local_1e20;
            auVar6._16_8_ = lStack_1e10;
            auVar6._24_8_ = lStack_1e08;
            local_280 = vpcmpgtq_avx2(auVar14,auVar6);
            local_2a0 = local_1e40;
            uStack_298 = uStack_1e38;
            uStack_290 = uStack_1e30;
            uStack_288 = uStack_1e28;
            auVar50._8_8_ = uStack_1e38;
            auVar50._0_8_ = local_1e40;
            auVar50._16_8_ = uStack_1e30;
            auVar50._24_8_ = uStack_1e28;
            local_6a0 = vpand_avx2(local_280,auVar50);
            local_680 = uVar65;
            uStack_678 = uVar67;
            uStack_670 = uVar68;
            uStack_668 = uVar69;
            local_b60 = vpaddq_avx2(auVar8,local_6a0);
            auVar33._16_8_ = lStack_c90;
            auVar33._0_16_ = local_1fe0;
            auVar33._24_8_ = lStack_c88;
            auVar8 = vpblendvb_avx2(local_b40,local_b60,auVar33);
            local_2100._0_8_ = auVar8._0_8_;
            local_2100._8_8_ = auVar8._8_8_;
            local_2100._16_8_ = auVar8._16_8_;
            lStack_20e8 = auVar8._24_8_;
            local_ba0 = local_2100._0_8_;
            uStack_b98 = local_2100._8_8_;
            uStack_b90 = local_2100._16_8_;
            uStack_b88 = lStack_20e8;
            local_bc0 = local_1e20;
            lStack_bb8 = lStack_1e18;
            lStack_bb0 = lStack_1e10;
            lStack_ba8 = lStack_1e08;
            auVar32._8_8_ = lStack_1e18;
            auVar32._0_8_ = local_1e20;
            auVar32._16_8_ = lStack_1e10;
            auVar32._24_8_ = lStack_1e08;
            auVar31._8_8_ = lStack_cf8;
            auVar31._0_8_ = local_d00;
            auVar31._16_8_ = lStack_cf0;
            auVar31._24_8_ = lStack_ce8;
            auVar8 = vpblendvb_avx2(auVar8,auVar32,auVar31);
            local_21e0._0_8_ = auVar11._0_8_;
            local_21e0._8_8_ = auVar11._8_8_;
            local_21e0._16_8_ = auVar11._16_8_;
            local_21e0._24_8_ = auVar11._24_8_;
            local_c00 = local_21e0._0_8_;
            uStack_bf8 = local_21e0._8_8_;
            uStack_bf0 = local_21e0._16_8_;
            uStack_be8 = local_21e0._24_8_;
            local_c20 = local_22a0._0_8_;
            uStack_c18 = local_22a0._8_8_;
            uStack_c10 = local_22a0._16_8_;
            uStack_c08 = lStack_2288;
            auVar30._8_8_ = lStack_c38;
            auVar30._0_8_ = local_c40;
            auVar30._16_8_ = lStack_c30;
            auVar30._24_8_ = lStack_c28;
            local_c60 = vpblendvb_avx2(auVar11,_local_22a0,auVar30);
            local_6c0 = uVar60;
            uStack_6b8 = uVar62;
            uStack_6b0 = uVar63;
            uStack_6a8 = uVar64;
            local_6e0 = local_1e40;
            uStack_6d8 = uStack_1e38;
            uStack_6d0 = uStack_1e30;
            uStack_6c8 = uStack_1e28;
            auVar45._8_8_ = uStack_1e38;
            auVar45._0_8_ = local_1e40;
            auVar45._16_8_ = uStack_1e30;
            auVar45._24_8_ = uStack_1e28;
            local_c80 = vpaddq_avx2(auVar9,auVar45);
            auVar29._16_8_ = lStack_c90;
            auVar29._0_16_ = local_1fe0;
            auVar29._24_8_ = lStack_c88;
            auVar9 = vpblendvb_avx2(local_c60,local_c80,auVar29);
            local_2120._0_8_ = auVar9._0_8_;
            local_2120._8_8_ = auVar9._8_8_;
            local_2120._16_8_ = auVar9._16_8_;
            lStack_2108 = auVar9._24_8_;
            local_cc0 = local_2120._0_8_;
            uStack_cb8 = local_2120._8_8_;
            uStack_cb0 = local_2120._16_8_;
            uStack_ca8 = lStack_2108;
            local_ce0 = local_1e20;
            lStack_cd8 = lStack_1e18;
            lStack_cd0 = lStack_1e10;
            lStack_cc8 = lStack_1e08;
            auVar28._8_8_ = lStack_1e18;
            auVar28._0_8_ = local_1e20;
            auVar28._16_8_ = lStack_1e10;
            auVar28._24_8_ = lStack_1e08;
            auVar18._8_8_ = lStack_cf8;
            auVar18._0_8_ = local_d00;
            auVar18._16_8_ = lStack_cf0;
            auVar18._24_8_ = lStack_ce8;
            auVar9 = vpblendvb_avx2(auVar9,auVar28,auVar18);
            local_500 = local_22c0._0_8_;
            lStack_4f8 = local_22c0._8_8_;
            lStack_4f0 = local_22c0._16_8_;
            lStack_4e8 = local_22c0._24_8_;
            local_520 = local_1e80;
            lStack_518 = lStack_1e78;
            lStack_510 = lStack_1e70;
            lStack_508 = lStack_1e68;
            local_d60 = -(ulong)(local_22c0._0_8_ == local_1e80);
            lStack_d58 = -(ulong)(local_22c0._8_8_ == lStack_1e78);
            lStack_d50 = -(ulong)(local_22c0._16_8_ == lStack_1e70);
            lStack_d48 = -(ulong)(local_22c0._24_8_ == lStack_1e68);
            local_80._8_8_ = lStack_d58;
            local_80._0_8_ = local_d60;
            local_80._16_8_ = lStack_d50;
            local_80._24_8_ = lStack_d48;
            auVar6 = vpcmpeqd_avx2(local_80,local_80);
            auVar59._16_8_ = lVar114;
            auVar59._0_16_ = local_20c0._0_16_;
            auVar59._24_8_ = lVar116;
            _local_20c0 = vpandn_avx2(local_80,auVar59);
            local_20e0._0_8_ = auVar7._0_8_;
            local_20e0._8_8_ = auVar7._8_8_;
            local_20e0._16_8_ = auVar7._16_8_;
            lStack_20c8 = auVar7._24_8_;
            local_e0 = local_20e0._0_8_;
            uStack_d8 = local_20e0._8_8_;
            uStack_d0 = local_20e0._16_8_;
            uStack_c8 = lStack_20c8;
            auVar58._8_8_ = lStack_d58;
            auVar58._0_8_ = local_d60;
            auVar58._16_8_ = lStack_d50;
            auVar58._24_8_ = lStack_d48;
            _local_20e0 = vpandn_avx2(auVar58,auVar7);
            local_2100._0_8_ = auVar8._0_8_;
            local_2100._8_8_ = auVar8._8_8_;
            local_2100._16_8_ = auVar8._16_8_;
            lStack_20e8 = auVar8._24_8_;
            local_120 = local_2100._0_8_;
            uStack_118 = local_2100._8_8_;
            uStack_110 = local_2100._16_8_;
            uStack_108 = lStack_20e8;
            auVar57._8_8_ = lStack_d58;
            auVar57._0_8_ = local_d60;
            auVar57._16_8_ = lStack_d50;
            auVar57._24_8_ = lStack_d48;
            _local_2100 = vpandn_avx2(auVar57,auVar8);
            local_2120._0_8_ = auVar9._0_8_;
            local_2120._8_8_ = auVar9._8_8_;
            local_2120._16_8_ = auVar9._16_8_;
            lStack_2108 = auVar9._24_8_;
            local_160 = local_2120._0_8_;
            uStack_158 = local_2120._8_8_;
            uStack_150 = local_2120._16_8_;
            uStack_148 = lStack_2108;
            auVar56._8_8_ = lStack_d58;
            auVar56._0_8_ = local_d60;
            auVar56._16_8_ = lStack_d50;
            auVar56._24_8_ = lStack_d48;
            _local_2120 = vpandn_avx2(auVar56,auVar9);
            local_d40 = local_1da0;
            uStack_d38 = uStack_1d98;
            uStack_d30 = uStack_1d90;
            uStack_d28 = uStack_1d88;
            auVar17._16_8_ = uVar113;
            auVar17._0_16_ = local_2140._0_16_;
            auVar17._24_8_ = uVar115;
            auVar16._8_8_ = uStack_1d98;
            auVar16._0_8_ = local_1da0;
            auVar16._16_8_ = uStack_1d90;
            auVar16._24_8_ = uStack_1d88;
            auVar7._8_8_ = lStack_d58;
            auVar7._0_8_ = local_d60;
            auVar7._16_8_ = lStack_d50;
            auVar7._24_8_ = lStack_d48;
            local_2140 = vpblendvb_avx2(auVar17,auVar16,auVar7);
            local_1a0 = local_21a0._0_8_;
            uStack_198 = local_21a0._8_8_;
            uStack_190 = local_21a0._16_8_;
            uStack_188 = local_21a0._24_8_;
            auVar55._8_8_ = lStack_d58;
            auVar55._0_8_ = local_d60;
            auVar55._16_8_ = lStack_d50;
            auVar55._24_8_ = lStack_d48;
            local_21a0 = vpandn_avx2(auVar55,auVar12);
            local_1e0 = local_21c0._0_8_;
            uStack_1d8 = local_21c0._8_8_;
            uStack_1d0 = local_21c0._16_8_;
            uStack_1c8 = local_21c0._24_8_;
            auVar54._8_8_ = lStack_d58;
            auVar54._0_8_ = local_d60;
            auVar54._16_8_ = lStack_d50;
            auVar54._24_8_ = lStack_d48;
            local_21c0 = vpandn_avx2(auVar54,auVar13);
            local_220 = local_21e0._0_8_;
            uStack_218 = local_21e0._8_8_;
            uStack_210 = local_21e0._16_8_;
            uStack_208 = local_21e0._24_8_;
            auVar53._8_8_ = lStack_d58;
            auVar53._0_8_ = local_d60;
            auVar53._16_8_ = lStack_d50;
            auVar53._24_8_ = lStack_d48;
            local_21e0 = vpand_avx2(auVar53 ^ auVar6,auVar11);
            local_d20 = uVar96;
            uStack_d18 = uVar111;
            uStack_d10 = uVar113;
            uStack_d08 = uVar115;
            local_be0 = local_d00;
            lStack_bd8 = lStack_cf8;
            lStack_bd0 = lStack_cf0;
            lStack_bc8 = lStack_ce8;
            local_b80 = local_ca0;
            lStack_b78 = lStack_c98;
            lStack_b70 = lStack_c90;
            lStack_b68 = lStack_c88;
            local_b20 = local_c40;
            lStack_b18 = lStack_c38;
            lStack_b10 = lStack_c30;
            lStack_b08 = lStack_c28;
            local_ac0 = local_d00;
            lStack_ab8 = lStack_cf8;
            lStack_ab0 = lStack_cf0;
            lStack_aa8 = lStack_ce8;
            local_a60 = local_ca0;
            lStack_a58 = lStack_c98;
            lStack_a50 = lStack_c90;
            lStack_a48 = lStack_c88;
            local_a00 = local_c40;
            lStack_9f8 = lStack_c38;
            lStack_9f0 = lStack_c30;
            lStack_9e8 = lStack_c28;
            lStack_4c8 = lStack_22e8;
            local_480 = lVar97;
            lStack_478 = lVar112;
            lStack_470 = lVar114;
            lStack_468 = lVar116;
            local_460 = local_2200._0_8_;
            lStack_458 = local_2200._8_8_;
            lStack_450 = local_2200._16_8_;
            lStack_448 = lStack_21e8;
            local_440 = lVar97;
            lStack_438 = lVar112;
            lStack_430 = lVar114;
            lStack_428 = lVar116;
            local_400 = lVar97;
            lStack_3f8 = lVar112;
            lStack_3f0 = lVar114;
            lStack_3e8 = lVar116;
            local_200 = local_d60;
            lStack_1f8 = lStack_d58;
            lStack_1f0 = lStack_d50;
            lStack_1e8 = lStack_d48;
            local_1c0 = local_d60;
            lStack_1b8 = lStack_d58;
            lStack_1b0 = lStack_d50;
            lStack_1a8 = lStack_d48;
            local_180 = local_d60;
            lStack_178 = lStack_d58;
            lStack_170 = lStack_d50;
            lStack_168 = lStack_d48;
            local_140 = local_d60;
            lStack_138 = lStack_d58;
            lStack_130 = lStack_d50;
            lStack_128 = lStack_d48;
            local_100 = local_d60;
            lStack_f8 = lStack_d58;
            lStack_f0 = lStack_d50;
            lStack_e8 = lStack_d48;
            local_c0 = local_d60;
            lStack_b8 = lStack_d58;
            lStack_b0 = lStack_d50;
            lStack_a8 = lStack_d48;
            local_a0 = lVar97;
            lStack_98 = lVar112;
            lStack_90 = lVar114;
            lStack_88 = lVar116;
            local_4c0 = auVar110._0_16_;
            auStack_4b0 = auVar110._16_16_;
            if (local_1c0c < local_1cc8) {
              a_04[1] = lVar144;
              a_04[0] = lVar87;
              a_04[2]._0_4_ = in_ESI;
              a_04[2]._4_4_ = in_stack_ffffffffffffdb0c;
              a_04[3] = in_stack_ffffffffffffdb10;
              b_04[1]._0_4_ = in_stack_ffffffffffffdae0;
              b_04[0] = lVar90;
              b_04[1]._4_4_ = in_stack_ffffffffffffdae4;
              b_04[2] = iVar88;
              b_04[3] = lVar86;
              _mm256_min_epi64_rpl(a_04,b_04);
              a_05[1] = lVar144;
              a_05[0] = lVar87;
              a_05[2]._0_4_ = in_ESI;
              a_05[2]._4_4_ = in_stack_ffffffffffffdb0c;
              a_05[3] = in_stack_ffffffffffffdb10;
              b_05[1]._0_4_ = in_stack_ffffffffffffdae0;
              b_05[0] = lVar90;
              b_05[1]._4_4_ = in_stack_ffffffffffffdae4;
              b_05[2] = iVar88;
              b_05[3] = lVar86;
              _mm256_max_epi64_rpl(a_05,b_05);
              a_06[1] = lVar144;
              a_06[0] = lVar87;
              a_06[2]._0_4_ = in_ESI;
              a_06[2]._4_4_ = in_stack_ffffffffffffdb0c;
              a_06[3] = in_stack_ffffffffffffdb10;
              b_06[1]._0_4_ = in_stack_ffffffffffffdae0;
              b_06[0] = lVar90;
              b_06[1]._4_4_ = in_stack_ffffffffffffdae4;
              b_06[2] = iVar88;
              b_06[3] = lVar86;
              _mm256_max_epi64_rpl(a_06,b_06);
              a_07[1] = lVar144;
              a_07[0] = lVar87;
              a_07[2]._0_4_ = in_ESI;
              a_07[2]._4_4_ = in_stack_ffffffffffffdb0c;
              a_07[3] = in_stack_ffffffffffffdb10;
              b_07[1]._0_4_ = in_stack_ffffffffffffdae0;
              b_07[0] = lVar90;
              b_07[1]._4_4_ = in_stack_ffffffffffffdae4;
              b_07[2] = iVar88;
              b_07[3] = lVar86;
              _mm256_max_epi64_rpl(a_07,b_07);
              a_08[1] = lVar144;
              a_08[0] = lVar87;
              a_08[2]._0_4_ = in_ESI;
              a_08[2]._4_4_ = in_stack_ffffffffffffdb0c;
              a_08[3] = in_stack_ffffffffffffdb10;
              b_08[1]._0_4_ = in_stack_ffffffffffffdae0;
              b_08[0] = lVar90;
              b_08[1]._4_4_ = in_stack_ffffffffffffdae4;
              b_08[2] = iVar88;
              b_08[3] = lVar86;
              _mm256_max_epi64_rpl(a_08,b_08);
            }
            vWH_00[1]._0_4_ = in_stack_ffffffffffffdaa0;
            vWH_00[0] = lVar93;
            vWH_00[1]._4_4_ = in_stack_ffffffffffffdaa4;
            vWH_00[2] = iVar91;
            vWH_00[3] = lVar143;
            arr_store_si256((int *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0),
                            vWH_00,(int32_t)((ulong)lVar142 >> 0x20),(int32_t)lVar142,
                            (int32_t)((ulong)iVar94 >> 0x20),(int32_t)iVar94);
            vWH_01[1]._0_4_ = in_stack_ffffffffffffdaa0;
            vWH_01[0] = lVar93;
            vWH_01[1]._4_4_ = in_stack_ffffffffffffdaa4;
            vWH_01[2] = iVar91;
            vWH_01[3] = lVar143;
            arr_store_si256((int *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0),
                            vWH_01,(int32_t)((ulong)lVar142 >> 0x20),(int32_t)lVar142,
                            (int32_t)((ulong)iVar94 >> 0x20),(int32_t)iVar94);
            vWH_02[1]._0_4_ = in_stack_ffffffffffffdaa0;
            vWH_02[0] = lVar93;
            vWH_02[1]._4_4_ = in_stack_ffffffffffffdaa4;
            vWH_02[2] = iVar91;
            vWH_02[3] = lVar143;
            arr_store_si256((int *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0),
                            vWH_02,(int32_t)((ulong)lVar142 >> 0x20),(int32_t)lVar142,
                            (int32_t)((ulong)iVar94 >> 0x20),(int32_t)iVar94);
            vWH_03[1]._0_4_ = in_stack_ffffffffffffdaa0;
            vWH_03[0] = lVar93;
            vWH_03[1]._4_4_ = in_stack_ffffffffffffdaa4;
            vWH_03[2] = iVar91;
            vWH_03[3] = lVar143;
            arr_store_si256((int *)CONCAT44(in_stack_ffffffffffffdac4,in_stack_ffffffffffffdac0),
                            vWH_03,(int32_t)((ulong)lVar142 >> 0x20),(int32_t)lVar142,
                            (int32_t)((ulong)iVar94 >> 0x20),(int32_t)iVar94);
            local_1c80[local_1cc8 + -3] = local_20c0._0_8_;
            local_1c88[local_1cc8 + -3] = local_20e0._0_8_;
            local_1c90[local_1cc8 + -3] = local_2100._0_8_;
            local_1c98[local_1cc8 + -3] = local_2120._0_8_;
            local_1ca0[local_1cc8 + -3] = local_2200._0_8_;
            local_1ca8[local_1cc8 + -3] = local_2260._0_8_;
            local_1cb0[local_1cc8 + -3] = local_2280._0_8_;
            local_1cb8[local_1cc8 + -3] = local_22a0._0_8_;
            local_13a0 = local_22c0._0_8_;
            lStack_1398 = local_22c0._8_8_;
            lStack_1390 = local_22c0._16_8_;
            lStack_1388 = local_22c0._24_8_;
            local_13c0 = local_1e80;
            lStack_13b8 = lStack_1e78;
            lStack_13b0 = lStack_1e70;
            lStack_13a8 = lStack_1e68;
            auVar24._8_8_ = lStack_1e78;
            auVar24._0_8_ = local_1e80;
            auVar24._16_8_ = lStack_1e70;
            auVar24._24_8_ = lStack_1e68;
            local_2c0 = vpcmpgtq_avx2(local_22c0,auVar24);
            uStack_13d0 = uStack_1fb0;
            uStack_13c8 = uStack_1fa8;
            local_1400 = local_22c0._0_8_;
            lStack_13f8 = local_22c0._8_8_;
            lStack_13f0 = local_22c0._16_8_;
            lStack_13e8 = local_22c0._24_8_;
            auVar23._16_8_ = uStack_1fb0;
            auVar23._0_16_ = auVar109._0_16_;
            auVar23._24_8_ = uStack_1fa8;
            local_2e0 = vpcmpgtq_avx2(auVar23,local_22c0);
            auVar9 = vpand_avx2(local_2c0,local_2e0);
            local_2420 = auVar9._0_8_;
            local_300 = local_2420;
            uStack_2418 = auVar9._8_8_;
            uStack_2f8 = uStack_2418;
            uStack_2410 = auVar9._16_8_;
            uStack_2f0 = uStack_2410;
            uStack_2408 = auVar9._24_8_;
            uStack_2e8 = uStack_2408;
            local_2340 = auVar10._0_8_;
            local_320 = local_2340;
            uStack_2338 = auVar10._8_8_;
            uStack_318 = uStack_2338;
            uStack_2330 = auVar10._16_8_;
            uStack_310 = uStack_2330;
            uStack_2328 = auVar10._24_8_;
            uStack_308 = uStack_2328;
            auVar9 = vpand_avx2(auVar9,auVar10);
            local_540 = local_20c0._0_8_;
            lStack_538 = local_20c0._8_8_;
            lStack_530 = local_20c0._16_8_;
            lStack_528 = lStack_20a8;
            local_560 = local_1ee0._0_8_;
            lStack_558 = local_1ee0._8_8_;
            lStack_550 = local_1ee0._16_8_;
            lStack_548 = local_1ee0._24_8_;
            local_3a0 = -(ulong)(local_20c0._0_8_ == local_1ee0._0_8_);
            lStack_398 = -(ulong)(local_20c0._8_8_ == local_1ee0._8_8_);
            lStack_390 = -(ulong)(local_20c0._16_8_ == local_1ee0._16_8_);
            lStack_388 = -(ulong)(lStack_20a8 == local_1ee0._24_8_);
            local_1420 = local_20c0._0_8_;
            lStack_1418 = local_20c0._8_8_;
            lStack_1410 = local_20c0._16_8_;
            lStack_1408 = lStack_20a8;
            local_1440 = local_1ee0._0_8_;
            lStack_1438 = local_1ee0._8_8_;
            lStack_1430 = local_1ee0._16_8_;
            lStack_1428 = local_1ee0._24_8_;
            auVar8 = vpcmpgtq_avx2(_local_20c0,local_1ee0);
            local_2480 = auVar8._0_8_;
            local_340 = local_2480;
            uStack_2478 = auVar8._8_8_;
            uStack_338 = uStack_2478;
            uStack_2470 = auVar8._16_8_;
            uStack_330 = uStack_2470;
            uStack_2468 = auVar8._24_8_;
            uStack_328 = uStack_2468;
            local_2440 = auVar9._0_8_;
            local_360 = local_2440;
            uStack_2438 = auVar9._8_8_;
            uStack_358 = uStack_2438;
            uStack_2430 = auVar9._16_8_;
            uStack_350 = uStack_2430;
            uStack_2428 = auVar9._24_8_;
            uStack_348 = uStack_2428;
            auVar8 = vpand_avx2(auVar8,auVar9);
            local_1460 = local_1f80._0_8_;
            uStack_1458 = local_1f80._8_8_;
            uStack_1450 = local_1f80._16_8_;
            uStack_1448 = local_1f80._24_8_;
            local_1480 = local_22c0._0_8_;
            lStack_1478 = local_22c0._8_8_;
            lStack_1470 = local_22c0._16_8_;
            lStack_1468 = local_22c0._24_8_;
            auVar14 = vpcmpgtq_avx2(local_1f80,local_22c0);
            local_d80 = local_1ee0._0_8_;
            lStack_d78 = local_1ee0._8_8_;
            lStack_d70 = local_1ee0._16_8_;
            lStack_d68 = local_1ee0._24_8_;
            local_da0 = local_20c0._0_8_;
            lStack_d98 = local_20c0._8_8_;
            lStack_d90 = local_20c0._16_8_;
            lStack_d88 = lStack_20a8;
            local_24a0 = auVar8._0_8_;
            local_dc0 = local_24a0;
            uStack_2498 = auVar8._8_8_;
            uStack_db8 = uStack_2498;
            uStack_2490 = auVar8._16_8_;
            uStack_db0 = uStack_2490;
            uStack_2488 = auVar8._24_8_;
            uStack_da8 = uStack_2488;
            local_1ee0 = vpblendvb_avx2(local_1ee0,_local_20c0,auVar8);
            local_de0 = local_1f00._0_8_;
            uStack_dd8 = local_1f00._8_8_;
            uStack_dd0 = local_1f00._16_8_;
            uStack_dc8 = local_1f00._24_8_;
            local_e00 = local_20e0._0_8_;
            uStack_df8 = local_20e0._8_8_;
            uStack_df0 = local_20e0._16_8_;
            uStack_de8 = lStack_20c8;
            local_e20 = local_24a0;
            uStack_e18 = uStack_2498;
            uStack_e10 = uStack_2490;
            uStack_e08 = uStack_2488;
            auVar7 = vpblendvb_avx2(local_1f00,_local_20e0,auVar8);
            local_e40 = local_1f20._0_8_;
            uStack_e38 = local_1f20._8_8_;
            uStack_e30 = local_1f20._16_8_;
            uStack_e28 = local_1f20._24_8_;
            local_e60 = local_2100._0_8_;
            uStack_e58 = local_2100._8_8_;
            uStack_e50 = local_2100._16_8_;
            uStack_e48 = lStack_20e8;
            local_e80 = local_24a0;
            uStack_e78 = uStack_2498;
            uStack_e70 = uStack_2490;
            uStack_e68 = uStack_2488;
            auVar6 = vpblendvb_avx2(local_1f20,_local_2100,auVar8);
            local_ea0 = local_1f40._0_8_;
            uStack_e98 = local_1f40._8_8_;
            uStack_e90 = local_1f40._16_8_;
            uStack_e88 = local_1f40._24_8_;
            local_ec0 = local_2120._0_8_;
            uStack_eb8 = local_2120._8_8_;
            uStack_eb0 = local_2120._16_8_;
            uStack_ea8 = lStack_2108;
            local_ee0 = local_24a0;
            uStack_ed8 = uStack_2498;
            uStack_ed0 = uStack_2490;
            uStack_ec8 = uStack_2488;
            auVar11 = vpblendvb_avx2(local_1f40,_local_2120,auVar8);
            local_f00 = local_1f60._0_8_;
            uStack_ef8 = local_1f60._8_8_;
            uStack_ef0 = local_1f60._16_8_;
            uStack_ee8 = local_1f60._24_8_;
            local_f20 = local_1ea0._0_8_;
            uStack_f18 = local_1ea0._8_8_;
            uStack_f10 = local_1ea0._16_8_;
            uStack_f08 = local_1ea0._24_8_;
            local_f40 = local_24a0;
            uStack_f38 = uStack_2498;
            uStack_f30 = uStack_2490;
            uStack_f28 = uStack_2488;
            auVar12 = vpblendvb_avx2(local_1f60,local_1ea0,auVar8);
            local_f60 = local_1f80._0_8_;
            uStack_f58 = local_1f80._8_8_;
            uStack_f50 = local_1f80._16_8_;
            uStack_f48 = local_1f80._24_8_;
            local_f80 = local_22c0._0_8_;
            lStack_f78 = local_22c0._8_8_;
            lStack_f70 = local_22c0._16_8_;
            lStack_f68 = local_22c0._24_8_;
            local_fa0 = local_24a0;
            uStack_f98 = uStack_2498;
            uStack_f90 = uStack_2490;
            uStack_f88 = uStack_2488;
            auVar13 = vpblendvb_avx2(local_1f80,local_22c0,auVar8);
            local_24c0 = auVar14._0_8_;
            local_380 = local_24c0;
            uStack_24b8 = auVar14._8_8_;
            uStack_378 = uStack_24b8;
            uStack_24b0 = auVar14._16_8_;
            uStack_370 = uStack_24b0;
            uStack_24a8 = auVar14._24_8_;
            uStack_368 = uStack_24a8;
            auVar49._8_8_ = lStack_398;
            auVar49._0_8_ = local_3a0;
            auVar49._16_8_ = lStack_390;
            auVar49._24_8_ = lStack_388;
            auVar8 = vpand_avx2(auVar14,auVar49);
            local_24a0 = auVar8._0_8_;
            local_3c0 = local_24a0;
            uStack_2498 = auVar8._8_8_;
            uStack_3b8 = uStack_2498;
            uStack_2490 = auVar8._16_8_;
            uStack_3b0 = uStack_2490;
            uStack_2488 = auVar8._24_8_;
            uStack_3a8 = uStack_2488;
            local_3e0 = local_2440;
            uStack_3d8 = uStack_2438;
            uStack_3d0 = uStack_2430;
            uStack_3c8 = uStack_2428;
            auVar9 = vpand_avx2(auVar8,auVar9);
            local_1f00._0_8_ = auVar7._0_8_;
            local_fc0 = local_1f00._0_8_;
            local_1f00._8_8_ = auVar7._8_8_;
            uStack_fb8 = local_1f00._8_8_;
            local_1f00._16_8_ = auVar7._16_8_;
            uStack_fb0 = local_1f00._16_8_;
            local_1f00._24_8_ = auVar7._24_8_;
            uStack_fa8 = local_1f00._24_8_;
            local_fe0 = local_20e0._0_8_;
            uStack_fd8 = local_20e0._8_8_;
            uStack_fd0 = local_20e0._16_8_;
            uStack_fc8 = lStack_20c8;
            local_24a0 = auVar9._0_8_;
            local_1000 = local_24a0;
            uStack_2498 = auVar9._8_8_;
            uStack_ff8 = uStack_2498;
            uStack_2490 = auVar9._16_8_;
            uStack_ff0 = uStack_2490;
            uStack_2488 = auVar9._24_8_;
            uStack_fe8 = uStack_2488;
            local_1f00 = vpblendvb_avx2(auVar7,_local_20e0,auVar9);
            local_1f20._0_8_ = auVar6._0_8_;
            local_1020 = local_1f20._0_8_;
            local_1f20._8_8_ = auVar6._8_8_;
            uStack_1018 = local_1f20._8_8_;
            local_1f20._16_8_ = auVar6._16_8_;
            uStack_1010 = local_1f20._16_8_;
            local_1f20._24_8_ = auVar6._24_8_;
            uStack_1008 = local_1f20._24_8_;
            local_1040 = local_2100._0_8_;
            uStack_1038 = local_2100._8_8_;
            uStack_1030 = local_2100._16_8_;
            uStack_1028 = lStack_20e8;
            local_1060 = local_24a0;
            uStack_1058 = uStack_2498;
            uStack_1050 = uStack_2490;
            uStack_1048 = uStack_2488;
            local_1f20 = vpblendvb_avx2(auVar6,_local_2100,auVar9);
            local_1f40._0_8_ = auVar11._0_8_;
            local_1080 = local_1f40._0_8_;
            local_1f40._8_8_ = auVar11._8_8_;
            uStack_1078 = local_1f40._8_8_;
            local_1f40._16_8_ = auVar11._16_8_;
            uStack_1070 = local_1f40._16_8_;
            local_1f40._24_8_ = auVar11._24_8_;
            uStack_1068 = local_1f40._24_8_;
            local_10a0 = local_2120._0_8_;
            uStack_1098 = local_2120._8_8_;
            uStack_1090 = local_2120._16_8_;
            uStack_1088 = lStack_2108;
            local_10c0 = local_24a0;
            uStack_10b8 = uStack_2498;
            uStack_10b0 = uStack_2490;
            uStack_10a8 = uStack_2488;
            local_1f40 = vpblendvb_avx2(auVar11,_local_2120,auVar9);
            local_1f60._0_8_ = auVar12._0_8_;
            local_10e0 = local_1f60._0_8_;
            local_1f60._8_8_ = auVar12._8_8_;
            uStack_10d8 = local_1f60._8_8_;
            local_1f60._16_8_ = auVar12._16_8_;
            uStack_10d0 = local_1f60._16_8_;
            local_1f60._24_8_ = auVar12._24_8_;
            uStack_10c8 = local_1f60._24_8_;
            local_1100 = local_1ea0._0_8_;
            uStack_10f8 = local_1ea0._8_8_;
            uStack_10f0 = local_1ea0._16_8_;
            uStack_10e8 = local_1ea0._24_8_;
            local_1120 = local_24a0;
            uStack_1118 = uStack_2498;
            uStack_1110 = uStack_2490;
            uStack_1108 = uStack_2488;
            local_1f60 = vpblendvb_avx2(auVar12,local_1ea0,auVar9);
            local_1f80._0_8_ = auVar13._0_8_;
            local_1140 = local_1f80._0_8_;
            local_1f80._8_8_ = auVar13._8_8_;
            uStack_1138 = local_1f80._8_8_;
            local_1f80._16_8_ = auVar13._16_8_;
            uStack_1130 = local_1f80._16_8_;
            local_1f80._24_8_ = auVar13._24_8_;
            uStack_1128 = local_1f80._24_8_;
            local_1160 = local_22c0._0_8_;
            lStack_1158 = local_22c0._8_8_;
            lStack_1150 = local_22c0._16_8_;
            lStack_1148 = local_22c0._24_8_;
            local_1180 = local_24a0;
            uStack_1178 = uStack_2498;
            uStack_1170 = uStack_2490;
            uStack_1168 = uStack_2488;
            local_1f80 = vpblendvb_avx2(auVar13,local_22c0,auVar9);
            local_700 = local_22c0._0_8_;
            lStack_6f8 = local_22c0._8_8_;
            lStack_6f0 = local_22c0._16_8_;
            lStack_6e8 = local_22c0._24_8_;
            local_720 = local_1e40;
            uStack_718 = uStack_1e38;
            uStack_710 = uStack_1e30;
            uStack_708 = uStack_1e28;
            auVar44._8_8_ = uStack_1e38;
            auVar44._0_8_ = local_1e40;
            auVar44._16_8_ = uStack_1e30;
            auVar44._24_8_ = uStack_1e28;
            local_22c0 = vpaddq_avx2(local_22c0,auVar44);
            local_1cc8 = local_1cc8 + 1;
            _local_2300 = auVar15;
            local_20a0 = auVar19;
            local_2080 = auVar20;
            local_2060 = auVar21;
            local_2040 = auVar22;
            local_13e0 = auVar109._0_16_;
          }
          local_740 = local_1ea0._0_8_;
          uStack_738 = local_1ea0._8_8_;
          uStack_730 = local_1ea0._16_8_;
          uStack_728 = local_1ea0._24_8_;
          local_760 = local_1e60;
          uStack_758 = uStack_1e58;
          uStack_750 = uStack_1e50;
          uStack_748 = uStack_1e48;
          auVar8._8_8_ = uStack_1e58;
          auVar8._0_8_ = local_1e60;
          auVar8._16_8_ = uStack_1e50;
          auVar8._24_8_ = uStack_1e48;
          local_1ea0 = vpaddq_avx2(local_1ea0,auVar8);
        }
        local_24c8 = (ulong *)local_1ee0;
        local_24d0 = (ulong *)local_1f00;
        local_24d8 = (ulong *)local_1f20;
        local_24e0 = (ulong *)local_1f40;
        local_24e8 = (long *)local_1f60;
        plVar146 = (long *)local_1f80;
        for (iVar145 = 0; iVar145 < local_1c08; iVar145 = iVar145 + 1) {
          if ((long)local_1ce8 < (long)*local_24c8) {
            local_1ce8 = *local_24c8;
            local_1cf0 = *local_24d0;
            local_1cf8 = *local_24d8;
            local_1d00 = *local_24e0;
            local_1ccc = (int)*local_24e8;
            local_1cd0 = (int)*plVar146;
          }
          else if (*local_24c8 == local_1ce8) {
            if (*plVar146 < (long)local_1cd0) {
              local_1cf0 = *local_24d0;
              local_1cf8 = *local_24d8;
              local_1d00 = *local_24e0;
              local_1ccc = (int)*local_24e8;
              local_1cd0 = (int)*plVar146;
            }
            else if ((*plVar146 == (long)local_1cd0) && (*local_24e8 < (long)local_1ccc)) {
              local_1cf0 = *local_24d0;
              local_1cf8 = *local_24d8;
              local_1d00 = *local_24e0;
              local_1ccc = (int)*local_24e8;
              local_1cd0 = (int)*plVar146;
            }
          }
          local_24c8 = local_24c8 + 1;
          local_24d0 = local_24d0 + 1;
          local_24d8 = local_24d8 + 1;
          local_24e0 = local_24e0 + 1;
          local_24e8 = local_24e8 + 1;
          plVar146 = plVar146 + 1;
        }
        local_14a0 = local_1d20;
        uStack_1498 = uStack_1d18;
        uStack_1490 = uStack_1d10;
        uStack_1488 = uStack_1d08;
        local_14c0 = local_1d60;
        uStack_14b8 = uStack_1d58;
        uStack_14b0 = uStack_1d50;
        uStack_14a8 = uStack_1d48;
        auVar22._8_8_ = uStack_1d18;
        auVar22._0_8_ = local_1d20;
        auVar22._16_8_ = uStack_1d10;
        auVar22._24_8_ = uStack_1d08;
        auVar21._8_8_ = uStack_1d58;
        auVar21._0_8_ = local_1d60;
        auVar21._16_8_ = uStack_1d50;
        auVar21._24_8_ = uStack_1d48;
        local_1b60 = vpcmpgtq_avx2(auVar22,auVar21);
        local_14e0 = local_1d80;
        uStack_14d8 = uStack_1d78;
        uStack_14d0 = uStack_1d70;
        uStack_14c8 = uStack_1d68;
        local_1500 = local_1d40;
        uStack_14f8 = uStack_1d38;
        uStack_14f0 = uStack_1d30;
        uStack_14e8 = uStack_1d28;
        auVar20._8_8_ = uStack_1d78;
        auVar20._0_8_ = local_1d80;
        auVar20._16_8_ = uStack_1d70;
        auVar20._24_8_ = uStack_1d68;
        auVar19._8_8_ = uStack_1d38;
        auVar19._0_8_ = local_1d40;
        auVar19._16_8_ = uStack_1d30;
        auVar19._24_8_ = uStack_1d28;
        local_1b80 = vpcmpgtq_avx2(auVar20,auVar19);
        local_60 = vpor_avx2(local_1b60,local_1b80);
        if ((((((((((((((((((((((((((((((((local_60 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_60 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_60 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_60 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_60 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_60 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_60 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_60 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_60 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_60 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_60 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_60 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_60 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_60 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_60 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_60 >> 0x7f,0) != '\0') ||
                          (local_60 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_60 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_60 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_60 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_60 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_60 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_60 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_60 >> 0xbf,0) != '\0') ||
                  (local_60 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_60 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_60 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_60 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_60 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_60 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_60 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_60[0x1f] < '\0') {
          local_1cc0->flag = local_1cc0->flag | 0x40;
          local_1ce8 = 0;
          local_1cf0 = 0;
          local_1cf8 = 0;
          local_1d00 = 0;
          local_1ccc = 0;
          local_1cd0 = 0;
        }
        local_1cc0->score = (int)local_1ce8;
        local_1cc0->end_query = local_1ccc;
        local_1cc0->end_ref = local_1cd0;
        ((local_1cc0->field_4).stats)->matches = (int)local_1cf0;
        ((local_1cc0->field_4).stats)->similar = (int)local_1cf8;
        ((local_1cc0->field_4).stats)->length = (int)local_1d00;
        parasail_free(local_1c70);
        parasail_free(local_1c68);
        parasail_free(local_1c60);
        parasail_free(local_1c58);
        parasail_free(local_1c50);
        parasail_free(local_1c48);
        parasail_free(local_1c40);
        parasail_free(local_1c38);
        parasail_free(local_1c30);
        parasail_free(local_1c28);
        local_1be0 = local_1cc0;
      }
    }
  }
  return local_1be0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i case0 = vZero;
        __m256i vNH = vNegInf0;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vNegInf0;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            case0 = _mm256_cmpeq_epi64(vWH, vZero);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWM = _mm256_blendv_epi8(vWM, vZero, case0);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(vWS, vZero, case0);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            vWL = _mm256_blendv_epi8(vWL, vZero, case0);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *m = (int64_t*)&vMaxM;
        int64_t *s = (int64_t*)&vMaxS;
        int64_t *l = (int64_t*)&vMaxL;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++m, ++s, ++l, ++i, ++j) {
            if (*t > score) {
                score = *t;
                matches = *m;
                similar = *s;
                length = *l;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    matches = *m;
                    similar = *s;
                    length = *l;
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}